

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersector1<8>::
     occluded_t<embree::avx512::SweepCurve1Intersector1<embree::CatmullRomCurveT>,embree::avx512::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined8 uVar14;
  ulong uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  int iVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  byte bVar69;
  byte bVar70;
  byte bVar71;
  uint uVar72;
  byte bVar73;
  long lVar74;
  uint uVar75;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  ulong uVar76;
  ulong uVar77;
  bool bVar78;
  bool bVar79;
  ulong uVar80;
  uint uVar133;
  uint uVar134;
  uint uVar135;
  uint uVar136;
  uint uVar137;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  uint uVar138;
  float pp;
  float fVar139;
  undefined4 uVar140;
  undefined1 auVar141 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar156;
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar142 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  float fVar191;
  float fVar192;
  float fVar207;
  float fVar208;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar218;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  float fVar216;
  float fVar217;
  float fVar219;
  float fVar220;
  float fVar221;
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  undefined1 auVar227 [32];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [64];
  float fVar239;
  float fVar245;
  float fVar246;
  undefined1 auVar240 [16];
  float fVar247;
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [64];
  undefined1 auVar248 [28];
  float fVar249;
  undefined1 auVar250 [32];
  undefined1 auVar251 [64];
  undefined1 auVar252 [32];
  float s;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  undefined1 auVar268 [64];
  undefined1 auVar269 [64];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  int local_908;
  int local_8f0;
  undefined2 local_8ea;
  ulong local_8e8;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  undefined4 uStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [16];
  undefined1 local_850 [16];
  undefined1 local_840 [16];
  undefined4 local_828;
  uint local_824;
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  RTCFilterFunctionNArguments local_750;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined1 local_620 [32];
  undefined8 local_600;
  undefined4 local_5f8;
  float local_5f4;
  undefined4 local_5f0;
  undefined4 local_5ec;
  undefined4 local_5e8;
  uint local_5e4;
  uint local_5e0;
  ulong local_5c8;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  Primitive *local_470;
  ulong local_468;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_390 [16];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar121 [32];
  undefined1 auVar244 [64];
  
  PVar3 = prim[1];
  uVar77 = (ulong)(byte)PVar3;
  fVar192 = *(float *)(prim + uVar77 * 0x19 + 0x12);
  auVar13 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar77 * 0x19 + 6));
  fVar191 = fVar192 * auVar13._0_4_;
  fVar139 = fVar192 * (ray->dir).field_0.m128[0];
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar77 * 4 + 6);
  auVar94 = vpmovsxbd_avx2(auVar83);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar77 * 5 + 6);
  auVar91 = vpmovsxbd_avx2(auVar84);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar77 * 6 + 6);
  auVar92 = vpmovsxbd_avx2(auVar81);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar77 * 0xb + 6);
  auVar93 = vpmovsxbd_avx2(auVar87);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6);
  auVar100 = vpmovsxbd_avx2(auVar82);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar96 = vcvtdq2ps_avx(auVar100);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + (uint)(byte)PVar3 * 0xc + uVar77 + 6);
  auVar95 = vpmovsxbd_avx2(auVar85);
  auVar95 = vcvtdq2ps_avx(auVar95);
  uVar76 = (ulong)(uint)((int)(uVar77 * 9) * 2);
  auVar233._8_8_ = 0;
  auVar233._0_8_ = *(ulong *)(prim + uVar76 + 6);
  auVar97 = vpmovsxbd_avx2(auVar233);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar241._8_8_ = 0;
  auVar241._0_8_ = *(ulong *)(prim + uVar76 + uVar77 + 6);
  auVar98 = vpmovsxbd_avx2(auVar241);
  auVar98 = vcvtdq2ps_avx(auVar98);
  uVar80 = (ulong)(uint)((int)(uVar77 * 5) << 2);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar80 + 6);
  auVar90 = vpmovsxbd_avx2(auVar86);
  auVar99 = vcvtdq2ps_avx(auVar90);
  auVar110._4_4_ = fVar139;
  auVar110._0_4_ = fVar139;
  auVar110._8_4_ = fVar139;
  auVar110._12_4_ = fVar139;
  auVar110._16_4_ = fVar139;
  auVar110._20_4_ = fVar139;
  auVar110._24_4_ = fVar139;
  auVar110._28_4_ = fVar139;
  auVar101._8_4_ = 1;
  auVar101._0_8_ = 0x100000001;
  auVar101._12_4_ = 1;
  auVar101._16_4_ = 1;
  auVar101._20_4_ = 1;
  auVar101._24_4_ = 1;
  auVar101._28_4_ = 1;
  auVar88 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar103 = ZEXT1632(CONCAT412(fVar192 * (ray->dir).field_0.m128[3],
                                CONCAT48(fVar192 * (ray->dir).field_0.m128[2],
                                         CONCAT44(fVar192 * (ray->dir).field_0.m128[1],fVar139))));
  auVar102 = vpermps_avx2(auVar101,auVar103);
  auVar89 = vpermps_avx512vl(auVar88,auVar103);
  fVar139 = auVar89._0_4_;
  fVar207 = auVar89._4_4_;
  auVar103._4_4_ = fVar207 * auVar92._4_4_;
  auVar103._0_4_ = fVar139 * auVar92._0_4_;
  fVar208 = auVar89._8_4_;
  auVar103._8_4_ = fVar208 * auVar92._8_4_;
  fVar209 = auVar89._12_4_;
  auVar103._12_4_ = fVar209 * auVar92._12_4_;
  fVar210 = auVar89._16_4_;
  auVar103._16_4_ = fVar210 * auVar92._16_4_;
  fVar211 = auVar89._20_4_;
  auVar103._20_4_ = fVar211 * auVar92._20_4_;
  fVar156 = auVar89._24_4_;
  auVar103._24_4_ = fVar156 * auVar92._24_4_;
  auVar103._28_4_ = auVar100._28_4_;
  auVar100._4_4_ = auVar95._4_4_ * fVar207;
  auVar100._0_4_ = auVar95._0_4_ * fVar139;
  auVar100._8_4_ = auVar95._8_4_ * fVar208;
  auVar100._12_4_ = auVar95._12_4_ * fVar209;
  auVar100._16_4_ = auVar95._16_4_ * fVar210;
  auVar100._20_4_ = auVar95._20_4_ * fVar211;
  auVar100._24_4_ = auVar95._24_4_ * fVar156;
  auVar100._28_4_ = auVar90._28_4_;
  auVar90._4_4_ = auVar99._4_4_ * fVar207;
  auVar90._0_4_ = auVar99._0_4_ * fVar139;
  auVar90._8_4_ = auVar99._8_4_ * fVar208;
  auVar90._12_4_ = auVar99._12_4_ * fVar209;
  auVar90._16_4_ = auVar99._16_4_ * fVar210;
  auVar90._20_4_ = auVar99._20_4_ * fVar211;
  auVar90._24_4_ = auVar99._24_4_ * fVar156;
  auVar90._28_4_ = auVar89._28_4_;
  auVar83 = vfmadd231ps_fma(auVar103,auVar102,auVar91);
  auVar84 = vfmadd231ps_fma(auVar100,auVar102,auVar96);
  auVar81 = vfmadd231ps_fma(auVar90,auVar98,auVar102);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar110,auVar94);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar110,auVar93);
  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar97,auVar110);
  auVar111._4_4_ = fVar191;
  auVar111._0_4_ = fVar191;
  auVar111._8_4_ = fVar191;
  auVar111._12_4_ = fVar191;
  auVar111._16_4_ = fVar191;
  auVar111._20_4_ = fVar191;
  auVar111._24_4_ = fVar191;
  auVar111._28_4_ = fVar191;
  auVar90 = ZEXT1632(CONCAT412(fVar192 * auVar13._12_4_,
                               CONCAT48(fVar192 * auVar13._8_4_,
                                        CONCAT44(fVar192 * auVar13._4_4_,fVar191))));
  auVar100 = vpermps_avx2(auVar101,auVar90);
  auVar90 = vpermps_avx512vl(auVar88,auVar90);
  fVar192 = auVar90._0_4_;
  fVar139 = auVar90._4_4_;
  auVar102._4_4_ = fVar139 * auVar92._4_4_;
  auVar102._0_4_ = fVar192 * auVar92._0_4_;
  fVar207 = auVar90._8_4_;
  auVar102._8_4_ = fVar207 * auVar92._8_4_;
  fVar208 = auVar90._12_4_;
  auVar102._12_4_ = fVar208 * auVar92._12_4_;
  fVar209 = auVar90._16_4_;
  auVar102._16_4_ = fVar209 * auVar92._16_4_;
  fVar210 = auVar90._20_4_;
  auVar102._20_4_ = fVar210 * auVar92._20_4_;
  fVar211 = auVar90._24_4_;
  auVar102._24_4_ = fVar211 * auVar92._24_4_;
  auVar102._28_4_ = 1;
  auVar88._4_4_ = auVar95._4_4_ * fVar139;
  auVar88._0_4_ = auVar95._0_4_ * fVar192;
  auVar88._8_4_ = auVar95._8_4_ * fVar207;
  auVar88._12_4_ = auVar95._12_4_ * fVar208;
  auVar88._16_4_ = auVar95._16_4_ * fVar209;
  auVar88._20_4_ = auVar95._20_4_ * fVar210;
  auVar88._24_4_ = auVar95._24_4_ * fVar211;
  auVar88._28_4_ = auVar92._28_4_;
  auVar95._4_4_ = auVar99._4_4_ * fVar139;
  auVar95._0_4_ = auVar99._0_4_ * fVar192;
  auVar95._8_4_ = auVar99._8_4_ * fVar207;
  auVar95._12_4_ = auVar99._12_4_ * fVar208;
  auVar95._16_4_ = auVar99._16_4_ * fVar209;
  auVar95._20_4_ = auVar99._20_4_ * fVar210;
  auVar95._24_4_ = auVar99._24_4_ * fVar211;
  auVar95._28_4_ = auVar90._28_4_;
  auVar87 = vfmadd231ps_fma(auVar102,auVar100,auVar91);
  auVar82 = vfmadd231ps_fma(auVar88,auVar100,auVar96);
  auVar85 = vfmadd231ps_fma(auVar95,auVar100,auVar98);
  auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar111,auVar94);
  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar111,auVar93);
  auVar108._8_4_ = 0x7fffffff;
  auVar108._0_8_ = 0x7fffffff7fffffff;
  auVar108._12_4_ = 0x7fffffff;
  auVar108._16_4_ = 0x7fffffff;
  auVar108._20_4_ = 0x7fffffff;
  auVar108._24_4_ = 0x7fffffff;
  auVar108._28_4_ = 0x7fffffff;
  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar111,auVar97);
  auVar94 = vandps_avx(ZEXT1632(auVar83),auVar108);
  auVar109._8_4_ = 0x219392ef;
  auVar109._0_8_ = 0x219392ef219392ef;
  auVar109._12_4_ = 0x219392ef;
  auVar109._16_4_ = 0x219392ef;
  auVar109._20_4_ = 0x219392ef;
  auVar109._24_4_ = 0x219392ef;
  auVar109._28_4_ = 0x219392ef;
  uVar76 = vcmpps_avx512vl(auVar94,auVar109,1);
  bVar78 = (bool)((byte)uVar76 & 1);
  auVar89._0_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar83._0_4_;
  bVar78 = (bool)((byte)(uVar76 >> 1) & 1);
  auVar89._4_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar83._4_4_;
  bVar78 = (bool)((byte)(uVar76 >> 2) & 1);
  auVar89._8_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar83._8_4_;
  bVar78 = (bool)((byte)(uVar76 >> 3) & 1);
  auVar89._12_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar83._12_4_;
  auVar89._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * 0x219392ef;
  auVar89._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * 0x219392ef;
  auVar89._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * 0x219392ef;
  auVar89._28_4_ = (uint)(byte)(uVar76 >> 7) * 0x219392ef;
  auVar94 = vandps_avx(ZEXT1632(auVar84),auVar108);
  uVar76 = vcmpps_avx512vl(auVar94,auVar109,1);
  bVar78 = (bool)((byte)uVar76 & 1);
  auVar104._0_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar84._0_4_;
  bVar78 = (bool)((byte)(uVar76 >> 1) & 1);
  auVar104._4_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar84._4_4_;
  bVar78 = (bool)((byte)(uVar76 >> 2) & 1);
  auVar104._8_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar84._8_4_;
  bVar78 = (bool)((byte)(uVar76 >> 3) & 1);
  auVar104._12_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar84._12_4_;
  auVar104._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * 0x219392ef;
  auVar104._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * 0x219392ef;
  auVar104._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * 0x219392ef;
  auVar104._28_4_ = (uint)(byte)(uVar76 >> 7) * 0x219392ef;
  auVar94 = vandps_avx(ZEXT1632(auVar81),auVar108);
  uVar76 = vcmpps_avx512vl(auVar94,auVar109,1);
  bVar78 = (bool)((byte)uVar76 & 1);
  auVar94._0_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar81._0_4_;
  bVar78 = (bool)((byte)(uVar76 >> 1) & 1);
  auVar94._4_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar81._4_4_;
  bVar78 = (bool)((byte)(uVar76 >> 2) & 1);
  auVar94._8_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar81._8_4_;
  bVar78 = (bool)((byte)(uVar76 >> 3) & 1);
  auVar94._12_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar81._12_4_;
  auVar94._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * 0x219392ef;
  auVar94._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * 0x219392ef;
  auVar94._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * 0x219392ef;
  auVar94._28_4_ = (uint)(byte)(uVar76 >> 7) * 0x219392ef;
  auVar91 = vrcp14ps_avx512vl(auVar89);
  auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar268 = ZEXT3264(auVar92);
  auVar93 = vfnmadd213ps_avx512vl(auVar89,auVar91,auVar92);
  auVar83 = vfmadd132ps_fma(auVar93,auVar91,auVar91);
  auVar91 = vrcp14ps_avx512vl(auVar104);
  auVar93 = vfnmadd213ps_avx512vl(auVar104,auVar91,auVar92);
  auVar84 = vfmadd132ps_fma(auVar93,auVar91,auVar91);
  auVar91 = vrcp14ps_avx512vl(auVar94);
  auVar94 = vfnmadd213ps_avx512vl(auVar94,auVar91,auVar92);
  auVar81 = vfmadd132ps_fma(auVar94,auVar91,auVar91);
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 * 7 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar87));
  auVar97._4_4_ = auVar83._4_4_ * auVar94._4_4_;
  auVar97._0_4_ = auVar83._0_4_ * auVar94._0_4_;
  auVar97._8_4_ = auVar83._8_4_ * auVar94._8_4_;
  auVar97._12_4_ = auVar83._12_4_ * auVar94._12_4_;
  auVar97._16_4_ = auVar94._16_4_ * 0.0;
  auVar97._20_4_ = auVar94._20_4_ * 0.0;
  auVar97._24_4_ = auVar94._24_4_ * 0.0;
  auVar97._28_4_ = auVar94._28_4_;
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 * 9 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar87));
  auVar95 = vpbroadcastd_avx512vl();
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar3 * 0x10 + 6));
  auVar107._0_4_ = auVar83._0_4_ * auVar94._0_4_;
  auVar107._4_4_ = auVar83._4_4_ * auVar94._4_4_;
  auVar107._8_4_ = auVar83._8_4_ * auVar94._8_4_;
  auVar107._12_4_ = auVar83._12_4_ * auVar94._12_4_;
  auVar107._16_4_ = auVar94._16_4_ * 0.0;
  auVar107._20_4_ = auVar94._20_4_ * 0.0;
  auVar107._24_4_ = auVar94._24_4_ * 0.0;
  auVar107._28_4_ = 0;
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar3 * 0x10 + uVar77 * -2 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar82));
  auVar98._4_4_ = auVar84._4_4_ * auVar94._4_4_;
  auVar98._0_4_ = auVar84._0_4_ * auVar94._0_4_;
  auVar98._8_4_ = auVar84._8_4_ * auVar94._8_4_;
  auVar98._12_4_ = auVar84._12_4_ * auVar94._12_4_;
  auVar98._16_4_ = auVar94._16_4_ * 0.0;
  auVar98._20_4_ = auVar94._20_4_ * 0.0;
  auVar98._24_4_ = auVar94._24_4_ * 0.0;
  auVar98._28_4_ = auVar94._28_4_;
  auVar94 = vcvtdq2ps_avx(auVar91);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar82));
  auVar106._0_4_ = auVar84._0_4_ * auVar94._0_4_;
  auVar106._4_4_ = auVar84._4_4_ * auVar94._4_4_;
  auVar106._8_4_ = auVar84._8_4_ * auVar94._8_4_;
  auVar106._12_4_ = auVar84._12_4_ * auVar94._12_4_;
  auVar106._16_4_ = auVar94._16_4_ * 0.0;
  auVar106._20_4_ = auVar94._20_4_ * 0.0;
  auVar106._24_4_ = auVar94._24_4_ * 0.0;
  auVar106._28_4_ = 0;
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar80 + uVar77 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar85));
  auVar99._4_4_ = auVar94._4_4_ * auVar81._4_4_;
  auVar99._0_4_ = auVar94._0_4_ * auVar81._0_4_;
  auVar99._8_4_ = auVar94._8_4_ * auVar81._8_4_;
  auVar99._12_4_ = auVar94._12_4_ * auVar81._12_4_;
  auVar99._16_4_ = auVar94._16_4_ * 0.0;
  auVar99._20_4_ = auVar94._20_4_ * 0.0;
  auVar99._24_4_ = auVar94._24_4_ * 0.0;
  auVar99._28_4_ = auVar94._28_4_;
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 * 0x17 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar85));
  auVar105._0_4_ = auVar81._0_4_ * auVar94._0_4_;
  auVar105._4_4_ = auVar81._4_4_ * auVar94._4_4_;
  auVar105._8_4_ = auVar81._8_4_ * auVar94._8_4_;
  auVar105._12_4_ = auVar81._12_4_ * auVar94._12_4_;
  auVar105._16_4_ = auVar94._16_4_ * 0.0;
  auVar105._20_4_ = auVar94._20_4_ * 0.0;
  auVar105._24_4_ = auVar94._24_4_ * 0.0;
  auVar105._28_4_ = 0;
  auVar94 = vpminsd_avx2(auVar97,auVar107);
  auVar91 = vpminsd_avx2(auVar98,auVar106);
  auVar94 = vmaxps_avx(auVar94,auVar91);
  auVar91 = vpminsd_avx2(auVar99,auVar105);
  uVar140 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar92._4_4_ = uVar140;
  auVar92._0_4_ = uVar140;
  auVar92._8_4_ = uVar140;
  auVar92._12_4_ = uVar140;
  auVar92._16_4_ = uVar140;
  auVar92._20_4_ = uVar140;
  auVar92._24_4_ = uVar140;
  auVar92._28_4_ = uVar140;
  auVar91 = vmaxps_avx512vl(auVar91,auVar92);
  auVar94 = vmaxps_avx(auVar94,auVar91);
  auVar91._8_4_ = 0x3f7ffffa;
  auVar91._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar91._12_4_ = 0x3f7ffffa;
  auVar91._16_4_ = 0x3f7ffffa;
  auVar91._20_4_ = 0x3f7ffffa;
  auVar91._24_4_ = 0x3f7ffffa;
  auVar91._28_4_ = 0x3f7ffffa;
  local_260 = vmulps_avx512vl(auVar94,auVar91);
  auVar94 = vpmaxsd_avx2(auVar97,auVar107);
  auVar91 = vpmaxsd_avx2(auVar98,auVar106);
  auVar94 = vminps_avx(auVar94,auVar91);
  auVar91 = vpmaxsd_avx2(auVar99,auVar105);
  fVar192 = ray->tfar;
  auVar93._4_4_ = fVar192;
  auVar93._0_4_ = fVar192;
  auVar93._8_4_ = fVar192;
  auVar93._12_4_ = fVar192;
  auVar93._16_4_ = fVar192;
  auVar93._20_4_ = fVar192;
  auVar93._24_4_ = fVar192;
  auVar93._28_4_ = fVar192;
  auVar91 = vminps_avx512vl(auVar91,auVar93);
  auVar94 = vminps_avx(auVar94,auVar91);
  auVar96._8_4_ = 0x3f800003;
  auVar96._0_8_ = 0x3f8000033f800003;
  auVar96._12_4_ = 0x3f800003;
  auVar96._16_4_ = 0x3f800003;
  auVar96._20_4_ = 0x3f800003;
  auVar96._24_4_ = 0x3f800003;
  auVar96._28_4_ = 0x3f800003;
  auVar94 = vmulps_avx512vl(auVar94,auVar96);
  uVar16 = vpcmpgtd_avx512vl(auVar95,_DAT_01fe9900);
  uVar14 = vcmpps_avx512vl(local_260,auVar94,2);
  if ((byte)((byte)uVar14 & (byte)uVar16) == 0) {
    return false;
  }
  local_468 = (ulong)(byte)((byte)uVar14 & (byte)uVar16);
  local_470 = prim;
LAB_01d0bafd:
  lVar74 = 0;
  for (uVar76 = local_468; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000) {
    lVar74 = lVar74 + 1;
  }
  local_8e8 = (ulong)*(uint *)(prim + 2);
  pGVar4 = (context->scene->geometries).items[*(uint *)(prim + 2)].ptr;
  local_5c8 = (ulong)*(uint *)(prim + lVar74 * 4 + 6);
  uVar76 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar74 * 4 + 6));
  p_Var5 = pGVar4[1].intersectionFilterN;
  lVar74 = *(long *)&pGVar4[1].time_range.upper;
  auVar83 = *(undefined1 (*) [16])(lVar74 + (long)p_Var5 * uVar76);
  auVar84 = *(undefined1 (*) [16])(lVar74 + (uVar76 + 1) * (long)p_Var5);
  local_468 = local_468 - 1 & local_468;
  if (local_468 != 0) {
    uVar77 = local_468 - 1 & local_468;
    for (uVar80 = local_468; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000) {
    }
    if (uVar77 != 0) {
      for (; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar222._0_4_ = auVar83._0_4_ + auVar84._0_4_;
  auVar222._4_4_ = auVar83._4_4_ + auVar84._4_4_;
  auVar222._8_4_ = auVar83._8_4_ + auVar84._8_4_;
  auVar222._12_4_ = auVar83._12_4_ + auVar84._12_4_;
  aVar1 = (ray->org).field_0;
  aVar2 = (ray->dir).field_0.field_1;
  auVar13._8_4_ = 0x3f000000;
  auVar13._0_8_ = 0x3f0000003f000000;
  auVar13._12_4_ = 0x3f000000;
  auVar81 = vmulps_avx512vl(auVar222,auVar13);
  auVar81 = vsubps_avx(auVar81,(undefined1  [16])aVar1);
  auVar81 = vdpps_avx(auVar81,(undefined1  [16])aVar2,0x7f);
  auVar87 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  auVar85 = ZEXT816(0) << 0x40;
  auVar251 = ZEXT1664(auVar85);
  auVar240._4_12_ = ZEXT812(0) << 0x20;
  auVar240._0_4_ = auVar87._0_4_;
  auVar82 = vrcp14ss_avx512f(auVar85,auVar240);
  auVar243 = ZEXT1664(auVar82);
  auVar87 = vfnmadd213ss_fma(auVar82,auVar87,ZEXT416(0x40000000));
  fVar192 = auVar81._0_4_ * auVar82._0_4_ * auVar87._0_4_;
  local_4c0 = ZEXT416((uint)fVar192);
  auVar223._4_4_ = fVar192;
  auVar223._0_4_ = fVar192;
  auVar223._8_4_ = fVar192;
  auVar223._12_4_ = fVar192;
  fStack_8b0 = fVar192;
  _local_8c0 = auVar223;
  fStack_8ac = fVar192;
  fStack_8a8 = fVar192;
  fStack_8a4 = fVar192;
  auVar81 = vfmadd231ps_fma((undefined1  [16])aVar1,(undefined1  [16])aVar2,auVar223);
  auVar81 = vblendps_avx(auVar81,auVar85,8);
  auVar83 = vsubps_avx(auVar83,auVar81);
  auVar87 = vsubps_avx(*(undefined1 (*) [16])(lVar74 + (uVar76 + 2) * (long)p_Var5),auVar81);
  local_620 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->dir).field_0.m128[0]));
  auVar260 = ZEXT3264(local_620);
  auVar91 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->dir).field_0.m128[1]));
  auVar263 = ZEXT3264(auVar91);
  local_7c0 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->dir).field_0.m128[2]));
  auVar262 = ZEXT3264(local_7c0);
  auVar84 = vsubps_avx(auVar84,auVar81);
  auVar238 = ZEXT1664(auVar84);
  auVar81 = vsubps_avx(*(undefined1 (*) [16])(lVar74 + (uVar76 + 3) * (long)p_Var5),auVar81);
  local_680 = vbroadcastss_avx512vl(auVar83);
  auVar255 = ZEXT3264(local_680);
  auVar112._8_4_ = 1;
  auVar112._0_8_ = 0x100000001;
  auVar112._12_4_ = 1;
  auVar112._16_4_ = 1;
  auVar112._20_4_ = 1;
  auVar112._24_4_ = 1;
  auVar112._28_4_ = 1;
  local_520 = ZEXT1632(auVar83);
  local_6a0 = vpermps_avx512vl(auVar112,local_520);
  auVar256 = ZEXT3264(local_6a0);
  auVar114._8_4_ = 2;
  auVar114._0_8_ = 0x200000002;
  auVar114._12_4_ = 2;
  auVar114._16_4_ = 2;
  auVar114._20_4_ = 2;
  auVar114._24_4_ = 2;
  auVar114._28_4_ = 2;
  local_7e0 = vpermps_avx512vl(auVar114,local_520);
  auVar257 = ZEXT3264(local_7e0);
  auVar117._8_4_ = 3;
  auVar117._0_8_ = 0x300000003;
  auVar117._12_4_ = 3;
  auVar117._16_4_ = 3;
  auVar117._20_4_ = 3;
  auVar117._24_4_ = 3;
  auVar117._28_4_ = 3;
  local_6c0 = vpermps_avx512vl(auVar117,local_520);
  auVar258 = ZEXT3264(local_6c0);
  local_800 = vbroadcastss_avx512vl(auVar84);
  auVar259 = ZEXT3264(local_800);
  local_560 = ZEXT1632(auVar84);
  local_6e0 = vpermps_avx512vl(auVar112,local_560);
  auVar261 = ZEXT3264(local_6e0);
  local_780 = vpermps_avx512vl(auVar114,local_560);
  auVar264 = ZEXT3264(local_780);
  local_7a0 = vpermps_avx512vl(auVar117,local_560);
  auVar265 = ZEXT3264(local_7a0);
  local_700 = vbroadcastss_avx512vl(auVar87);
  auVar266 = ZEXT3264(local_700);
  local_540 = ZEXT1632(auVar87);
  local_720 = vpermps_avx512vl(auVar112,local_540);
  auVar267 = ZEXT3264(local_720);
  local_820 = vpermps_avx512vl(auVar114,local_540);
  auVar269 = ZEXT3264(local_820);
  local_1e0 = vpermps_avx2(auVar117,local_540);
  local_240 = auVar81._0_4_;
  _local_580 = ZEXT1632(auVar81);
  local_340 = vpermps_avx2(auVar112,_local_580);
  local_360 = vpermps_avx2(auVar114,_local_580);
  _local_320 = vpermps_avx2(auVar117,_local_580);
  auVar94 = vpermps_avx2(auVar114,ZEXT1632(CONCAT412(aVar2.field_3.w * aVar2.field_3.w,
                                                     CONCAT48(aVar2.z * aVar2.z,
                                                              CONCAT44(aVar2.y * aVar2.y,
                                                                       aVar2.x * aVar2.x)))));
  auVar94 = vfmadd231ps_avx512vl(auVar94,auVar91,auVar91);
  local_200 = vfmadd231ps_avx512vl(auVar94,local_620,local_620);
  auVar113._8_4_ = 0x7fffffff;
  auVar113._0_8_ = 0x7fffffff7fffffff;
  auVar113._12_4_ = 0x7fffffff;
  auVar113._16_4_ = 0x7fffffff;
  auVar113._20_4_ = 0x7fffffff;
  auVar113._24_4_ = 0x7fffffff;
  auVar113._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_200,auVar113);
  local_220 = local_200;
  local_908 = 1;
  uVar76 = 0;
  bVar78 = false;
  local_390 = ZEXT816(0x3f80000000000000);
  fStack_23c = local_240;
  fStack_238 = local_240;
  fStack_234 = local_240;
  fStack_230 = local_240;
  fStack_22c = local_240;
  fStack_228 = local_240;
  fStack_224 = local_240;
  do {
    auVar83 = vmovshdup_avx(local_390);
    auVar83 = vsubps_avx(auVar83,local_390);
    auVar141._0_4_ = auVar83._0_4_;
    fVar156 = auVar141._0_4_ * 0.04761905;
    uVar140 = local_390._0_4_;
    local_4e0._4_4_ = uVar140;
    local_4e0._0_4_ = uVar140;
    local_4e0._8_4_ = uVar140;
    local_4e0._12_4_ = uVar140;
    local_4e0._16_4_ = uVar140;
    local_4e0._20_4_ = uVar140;
    local_4e0._24_4_ = uVar140;
    local_4e0._28_4_ = uVar140;
    auVar141._4_4_ = auVar141._0_4_;
    auVar141._8_4_ = auVar141._0_4_;
    auVar141._12_4_ = auVar141._0_4_;
    local_500._16_4_ = auVar141._0_4_;
    local_500._0_16_ = auVar141;
    local_500._20_4_ = auVar141._0_4_;
    local_500._24_4_ = auVar141._0_4_;
    local_500._28_4_ = auVar141._0_4_;
    auVar83 = vfmadd231ps_fma(local_4e0,local_500,_DAT_01faff20);
    auVar113 = auVar268._0_32_;
    auVar94 = vsubps_avx512vl(auVar113,ZEXT1632(auVar83));
    fVar191 = auVar83._0_4_;
    fVar216 = auVar83._4_4_;
    fVar217 = auVar83._8_4_;
    fVar218 = auVar83._12_4_;
    fVar219 = auVar94._0_4_;
    fVar220 = auVar94._4_4_;
    fVar221 = auVar94._8_4_;
    fVar228 = auVar94._12_4_;
    fVar229 = auVar94._16_4_;
    fVar230 = auVar94._20_4_;
    fVar231 = auVar94._24_4_;
    auVar35._4_4_ = fVar220 * fVar220 * -fVar216;
    auVar35._0_4_ = fVar219 * fVar219 * -fVar191;
    auVar35._8_4_ = fVar221 * fVar221 * -fVar217;
    auVar35._12_4_ = fVar228 * fVar228 * -fVar218;
    auVar35._16_4_ = fVar229 * fVar229 * -0.0;
    auVar35._20_4_ = fVar230 * fVar230 * -0.0;
    auVar35._24_4_ = fVar231 * fVar231 * -0.0;
    auVar35._28_4_ = 0x80000000;
    auVar238._0_28_ =
         ZEXT1628(CONCAT412(fVar218 * fVar218,
                            CONCAT48(fVar217 * fVar217,CONCAT44(fVar216 * fVar216,fVar191 * fVar191)
                                    )));
    local_880 = auVar238._0_32_;
    fVar239 = fVar191 * 3.0;
    fVar245 = fVar216 * 3.0;
    fVar246 = fVar217 * 3.0;
    fVar247 = fVar218 * 3.0;
    auVar244._28_36_ = auVar243._28_36_;
    auVar244._0_28_ = ZEXT1628(CONCAT412(fVar247,CONCAT48(fVar246,CONCAT44(fVar245,fVar239))));
    fVar249 = auVar243._28_4_ + -5.0;
    auVar167._0_4_ = (fVar239 + -5.0) * fVar191 * fVar191 + 2.0;
    auVar167._4_4_ = (fVar245 + -5.0) * fVar216 * fVar216 + 2.0;
    auVar167._8_4_ = (fVar246 + -5.0) * fVar217 * fVar217 + 2.0;
    auVar167._12_4_ = (fVar247 + -5.0) * fVar218 * fVar218 + 2.0;
    auVar167._16_4_ = 0x40000000;
    auVar167._20_4_ = 0x40000000;
    auVar167._24_4_ = 0x40000000;
    auVar167._28_4_ = DAT_01faff20._28_4_ + 2.0;
    auVar243._0_4_ = fVar219 * fVar219;
    auVar243._4_4_ = fVar220 * fVar220;
    auVar243._8_4_ = fVar221 * fVar221;
    auVar243._12_4_ = fVar228 * fVar228;
    auVar243._16_4_ = fVar229 * fVar229;
    auVar243._20_4_ = fVar230 * fVar230;
    auVar243._28_36_ = auVar251._28_36_;
    auVar243._24_4_ = fVar231 * fVar231;
    local_8a0._0_4_ = fVar219 * 3.0;
    local_8a0._4_4_ = fVar220 * 3.0;
    fStack_898 = fVar221 * 3.0;
    fStack_894 = fVar228 * 3.0;
    fStack_890 = fVar229 * 3.0;
    fStack_88c = fVar230 * 3.0;
    fStack_888 = fVar231 * 3.0;
    uStack_884 = 0x40400000;
    auVar185._0_4_ = auVar243._0_4_ * ((float)local_8a0._0_4_ + -5.0) + 2.0;
    auVar185._4_4_ = auVar243._4_4_ * ((float)local_8a0._4_4_ + -5.0) + 2.0;
    auVar185._8_4_ = auVar243._8_4_ * (fStack_898 + -5.0) + 2.0;
    auVar185._12_4_ = auVar243._12_4_ * (fStack_894 + -5.0) + 2.0;
    auVar185._16_4_ = auVar243._16_4_ * (fStack_890 + -5.0) + 2.0;
    auVar185._20_4_ = auVar243._20_4_ * (fStack_88c + -5.0) + 2.0;
    auVar185._24_4_ = auVar243._24_4_ * (fStack_888 + -5.0) + 2.0;
    auVar185._28_4_ = 0;
    fVar232 = auVar94._28_4_;
    auVar36._4_4_ = fVar216 * fVar216 * -fVar220;
    auVar36._0_4_ = fVar191 * fVar191 * -fVar219;
    auVar36._8_4_ = fVar217 * fVar217 * -fVar221;
    auVar36._12_4_ = fVar218 * fVar218 * -fVar228;
    auVar36._16_4_ = -fVar229 * 0.0 * 0.0;
    auVar36._20_4_ = -fVar230 * 0.0 * 0.0;
    auVar36._24_4_ = -fVar231 * 0.0 * 0.0;
    auVar36._28_4_ = -fVar232;
    auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar94 = vmulps_avx512vl(auVar35,auVar93);
    auVar96 = vmulps_avx512vl(auVar167,auVar93);
    auVar91 = vmulps_avx512vl(auVar185,auVar93);
    auVar92 = vmulps_avx512vl(auVar36,auVar93);
    fVar192 = auVar92._0_4_;
    fVar139 = auVar92._4_4_;
    auVar37._4_4_ = fStack_23c * fVar139;
    auVar37._0_4_ = local_240 * fVar192;
    fVar207 = auVar92._8_4_;
    auVar37._8_4_ = fStack_238 * fVar207;
    fVar208 = auVar92._12_4_;
    auVar37._12_4_ = fStack_234 * fVar208;
    fVar209 = auVar92._16_4_;
    auVar37._16_4_ = fStack_230 * fVar209;
    fVar210 = auVar92._20_4_;
    auVar37._20_4_ = fStack_22c * fVar210;
    fVar211 = auVar92._24_4_;
    auVar37._24_4_ = fStack_228 * fVar211;
    auVar37._28_4_ = 0;
    auVar38._4_4_ = local_340._4_4_ * fVar139;
    auVar38._0_4_ = local_340._0_4_ * fVar192;
    auVar38._8_4_ = local_340._8_4_ * fVar207;
    auVar38._12_4_ = local_340._12_4_ * fVar208;
    auVar38._16_4_ = local_340._16_4_ * fVar209;
    auVar38._20_4_ = local_340._20_4_ * fVar210;
    auVar38._24_4_ = local_340._24_4_ * fVar211;
    auVar38._28_4_ = auVar167._28_4_;
    auVar39._4_4_ = local_360._4_4_ * fVar139;
    auVar39._0_4_ = local_360._0_4_ * fVar192;
    auVar39._8_4_ = local_360._8_4_ * fVar207;
    auVar39._12_4_ = local_360._12_4_ * fVar208;
    auVar39._16_4_ = local_360._16_4_ * fVar209;
    auVar39._20_4_ = local_360._20_4_ * fVar210;
    auVar39._24_4_ = local_360._24_4_ * fVar211;
    auVar39._28_4_ = 0x80000000;
    auVar40._4_4_ = fVar139 * (float)local_320._4_4_;
    auVar40._0_4_ = fVar192 * (float)local_320._0_4_;
    auVar40._8_4_ = fVar207 * fStack_318;
    auVar40._12_4_ = fVar208 * fStack_314;
    auVar40._16_4_ = fVar209 * fStack_310;
    auVar40._20_4_ = fVar210 * fStack_30c;
    auVar40._24_4_ = fVar211 * fStack_308;
    auVar40._28_4_ = auVar92._28_4_;
    auVar92 = vfmadd231ps_avx512vl(auVar37,auVar91,auVar266._0_32_);
    auVar95 = vfmadd231ps_avx512vl(auVar38,auVar91,auVar267._0_32_);
    auVar97 = vfmadd231ps_avx512vl(auVar39,auVar91,auVar269._0_32_);
    auVar83 = vfmadd231ps_fma(auVar40,local_1e0,auVar91);
    auVar91 = vfmadd231ps_avx512vl(auVar92,auVar96,auVar259._0_32_);
    auVar92 = vfmadd231ps_avx512vl(auVar95,auVar96,auVar261._0_32_);
    auVar95 = vfmadd231ps_avx512vl(auVar97,auVar96,auVar264._0_32_);
    auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),auVar265._0_32_,auVar96);
    auVar98 = vfmadd231ps_avx512vl(auVar91,auVar94,auVar255._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar92,auVar94,auVar256._0_32_);
    auVar100 = vfmadd231ps_avx512vl(auVar95,auVar94,auVar257._0_32_);
    auVar95 = vfmadd231ps_avx512vl(auVar97,auVar258._0_32_,auVar94);
    auVar41._4_4_ = (fVar220 + fVar220) * fVar216;
    auVar41._0_4_ = (fVar219 + fVar219) * fVar191;
    auVar41._8_4_ = (fVar221 + fVar221) * fVar217;
    auVar41._12_4_ = (fVar228 + fVar228) * fVar218;
    auVar41._16_4_ = (fVar229 + fVar229) * 0.0;
    auVar41._20_4_ = (fVar230 + fVar230) * 0.0;
    auVar41._24_4_ = (fVar231 + fVar231) * 0.0;
    auVar41._28_4_ = auVar96._28_4_;
    auVar94 = vsubps_avx(auVar41,auVar243._0_32_);
    auVar214._0_28_ =
         ZEXT1628(CONCAT412((fVar218 + fVar218) * (fVar247 + -5.0) + fVar247 * fVar218,
                            CONCAT48((fVar217 + fVar217) * (fVar246 + -5.0) + fVar246 * fVar217,
                                     CONCAT44((fVar216 + fVar216) * (fVar245 + -5.0) +
                                              fVar245 * fVar216,
                                              (fVar191 + fVar191) * (fVar239 + -5.0) +
                                              fVar239 * fVar191))));
    auVar214._28_4_ = fVar249 + 0.0;
    auVar118._8_4_ = 0x40000000;
    auVar118._0_8_ = 0x4000000040000000;
    auVar118._12_4_ = 0x40000000;
    auVar118._16_4_ = 0x40000000;
    auVar118._20_4_ = 0x40000000;
    auVar118._24_4_ = 0x40000000;
    auVar118._28_4_ = 0x40000000;
    auVar91 = vaddps_avx512vl(auVar244._0_32_,auVar118);
    auVar42._4_4_ = (fVar220 + fVar220) * auVar91._4_4_;
    auVar42._0_4_ = (fVar219 + fVar219) * auVar91._0_4_;
    auVar42._8_4_ = (fVar221 + fVar221) * auVar91._8_4_;
    auVar42._12_4_ = (fVar228 + fVar228) * auVar91._12_4_;
    auVar42._16_4_ = (fVar229 + fVar229) * auVar91._16_4_;
    auVar42._20_4_ = (fVar230 + fVar230) * auVar91._20_4_;
    auVar42._24_4_ = (fVar231 + fVar231) * auVar91._24_4_;
    auVar42._28_4_ = auVar91._28_4_;
    auVar43._4_4_ = fVar220 * (float)local_8a0._4_4_;
    auVar43._0_4_ = fVar219 * (float)local_8a0._0_4_;
    auVar43._8_4_ = fVar221 * fStack_898;
    auVar43._12_4_ = fVar228 * fStack_894;
    auVar43._16_4_ = fVar229 * fStack_890;
    auVar43._20_4_ = fVar230 * fStack_88c;
    auVar43._24_4_ = fVar231 * fStack_888;
    auVar43._28_4_ = fVar232;
    auVar91 = vsubps_avx(auVar42,auVar43);
    auVar92 = vsubps_avx(auVar238._0_32_,auVar41);
    auVar97 = vmulps_avx512vl(auVar94,auVar93);
    auVar90 = vmulps_avx512vl(auVar214,auVar93);
    auVar91 = vmulps_avx512vl(auVar91,auVar93);
    auVar92 = vmulps_avx512vl(auVar92,auVar93);
    fVar192 = auVar92._0_4_;
    fVar139 = auVar92._4_4_;
    auVar44._4_4_ = fStack_23c * fVar139;
    auVar44._0_4_ = local_240 * fVar192;
    fVar207 = auVar92._8_4_;
    auVar44._8_4_ = fStack_238 * fVar207;
    fVar208 = auVar92._12_4_;
    auVar44._12_4_ = fStack_234 * fVar208;
    fVar209 = auVar92._16_4_;
    auVar44._16_4_ = fStack_230 * fVar209;
    fVar210 = auVar92._20_4_;
    auVar44._20_4_ = fStack_22c * fVar210;
    fVar211 = auVar92._24_4_;
    auVar44._24_4_ = fStack_228 * fVar211;
    auVar44._28_4_ = fVar249;
    auVar45._4_4_ = fVar139 * local_340._4_4_;
    auVar45._0_4_ = fVar192 * local_340._0_4_;
    auVar45._8_4_ = fVar207 * local_340._8_4_;
    auVar45._12_4_ = fVar208 * local_340._12_4_;
    auVar45._16_4_ = fVar209 * local_340._16_4_;
    auVar45._20_4_ = fVar210 * local_340._20_4_;
    auVar45._24_4_ = fVar211 * local_340._24_4_;
    auVar45._28_4_ = auVar94._28_4_;
    auVar46._4_4_ = fVar139 * local_360._4_4_;
    auVar46._0_4_ = fVar192 * local_360._0_4_;
    auVar46._8_4_ = fVar207 * local_360._8_4_;
    auVar46._12_4_ = fVar208 * local_360._12_4_;
    auVar46._16_4_ = fVar209 * local_360._16_4_;
    auVar46._20_4_ = fVar210 * local_360._20_4_;
    auVar46._24_4_ = fVar211 * local_360._24_4_;
    auVar46._28_4_ = auVar96._28_4_;
    auVar47._4_4_ = fVar139 * (float)local_320._4_4_;
    auVar47._0_4_ = fVar192 * (float)local_320._0_4_;
    auVar47._8_4_ = fVar207 * fStack_318;
    auVar47._12_4_ = fVar208 * fStack_314;
    auVar47._16_4_ = fVar209 * fStack_310;
    auVar47._20_4_ = fVar210 * fStack_30c;
    auVar47._24_4_ = fVar211 * fStack_308;
    auVar47._28_4_ = auVar92._28_4_;
    auVar94 = vfmadd231ps_avx512vl(auVar44,auVar91,auVar266._0_32_);
    auVar92 = vfmadd231ps_avx512vl(auVar45,auVar91,auVar267._0_32_);
    auVar93 = vfmadd231ps_avx512vl(auVar46,auVar91,auVar269._0_32_);
    auVar83 = vfmadd231ps_fma(auVar47,local_1e0,auVar91);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar90,auVar259._0_32_);
    auVar91 = vfmadd231ps_avx512vl(auVar92,auVar90,auVar261._0_32_);
    auVar92 = vfmadd231ps_avx512vl(auVar93,auVar90,auVar264._0_32_);
    auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),auVar265._0_32_,auVar90);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar97,auVar255._0_32_);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar97,auVar256._0_32_);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar97,auVar257._0_32_);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar258._0_32_,auVar97);
    auVar48._4_4_ = auVar94._4_4_ * fVar156;
    auVar48._0_4_ = auVar94._0_4_ * fVar156;
    auVar48._8_4_ = auVar94._8_4_ * fVar156;
    auVar48._12_4_ = auVar94._12_4_ * fVar156;
    auVar48._16_4_ = auVar94._16_4_ * fVar156;
    auVar48._20_4_ = auVar94._20_4_ * fVar156;
    auVar48._24_4_ = auVar94._24_4_ * fVar156;
    auVar48._28_4_ = fStack_224;
    auVar49._4_4_ = auVar91._4_4_ * fVar156;
    auVar49._0_4_ = auVar91._0_4_ * fVar156;
    auVar49._8_4_ = auVar91._8_4_ * fVar156;
    auVar49._12_4_ = auVar91._12_4_ * fVar156;
    auVar49._16_4_ = auVar91._16_4_ * fVar156;
    auVar49._20_4_ = auVar91._20_4_ * fVar156;
    auVar49._24_4_ = auVar91._24_4_ * fVar156;
    auVar49._28_4_ = fVar232 + fVar232;
    auVar50._4_4_ = auVar92._4_4_ * fVar156;
    auVar50._0_4_ = auVar92._0_4_ * fVar156;
    auVar50._8_4_ = auVar92._8_4_ * fVar156;
    auVar50._12_4_ = auVar92._12_4_ * fVar156;
    auVar50._16_4_ = auVar92._16_4_ * fVar156;
    auVar50._20_4_ = auVar92._20_4_ * fVar156;
    auVar50._24_4_ = auVar92._24_4_ * fVar156;
    auVar50._28_4_ = auVar92._28_4_;
    fVar192 = fVar156 * auVar93._0_4_;
    fVar139 = fVar156 * auVar93._4_4_;
    auVar51._4_4_ = fVar139;
    auVar51._0_4_ = fVar192;
    fVar207 = fVar156 * auVar93._8_4_;
    auVar51._8_4_ = fVar207;
    fVar208 = fVar156 * auVar93._12_4_;
    auVar51._12_4_ = fVar208;
    fVar209 = fVar156 * auVar93._16_4_;
    auVar51._16_4_ = fVar209;
    fVar210 = fVar156 * auVar93._20_4_;
    auVar51._20_4_ = fVar210;
    fVar211 = fVar156 * auVar93._24_4_;
    auVar51._24_4_ = fVar211;
    auVar51._28_4_ = fVar156;
    auVar83 = vxorps_avx512vl(auVar269._0_16_,auVar269._0_16_);
    auVar97 = vpermt2ps_avx512vl(auVar98,_DAT_01feed00,ZEXT1632(auVar83));
    auVar243 = ZEXT3264(auVar97);
    auVar90 = vpermt2ps_avx512vl(auVar99,_DAT_01feed00,ZEXT1632(auVar83));
    auVar92 = ZEXT1632(auVar83);
    auVar101 = vpermt2ps_avx512vl(auVar100,_DAT_01feed00,auVar92);
    auVar215._0_4_ = auVar95._0_4_ + fVar192;
    auVar215._4_4_ = auVar95._4_4_ + fVar139;
    auVar215._8_4_ = auVar95._8_4_ + fVar207;
    auVar215._12_4_ = auVar95._12_4_ + fVar208;
    auVar215._16_4_ = auVar95._16_4_ + fVar209;
    auVar215._20_4_ = auVar95._20_4_ + fVar210;
    auVar215._24_4_ = auVar95._24_4_ + fVar211;
    auVar215._28_4_ = auVar95._28_4_ + fVar156;
    auVar94 = vmaxps_avx(auVar95,auVar215);
    auVar91 = vminps_avx(auVar95,auVar215);
    auVar102 = vpermt2ps_avx512vl(auVar95,_DAT_01feed00,auVar92);
    auVar103 = vpermt2ps_avx512vl(auVar48,_DAT_01feed00,auVar92);
    auVar88 = vpermt2ps_avx512vl(auVar49,_DAT_01feed00,auVar92);
    auVar112 = ZEXT1632(auVar83);
    auVar89 = vpermt2ps_avx512vl(auVar50,_DAT_01feed00,auVar112);
    auVar92 = vpermt2ps_avx512vl(auVar51,_DAT_01feed00,auVar112);
    auVar92 = vsubps_avx(auVar102,auVar92);
    auVar93 = vsubps_avx(auVar97,auVar98);
    auVar238 = ZEXT3264(auVar93);
    auVar96 = vsubps_avx(auVar90,auVar99);
    auVar95 = vsubps_avx(auVar101,auVar100);
    auVar104 = vmulps_avx512vl(auVar96,auVar50);
    auVar104 = vfmsub231ps_avx512vl(auVar104,auVar49,auVar95);
    auVar105 = vmulps_avx512vl(auVar95,auVar48);
    auVar105 = vfmsub231ps_avx512vl(auVar105,auVar50,auVar93);
    auVar106 = vmulps_avx512vl(auVar93,auVar49);
    auVar106 = vfmsub231ps_avx512vl(auVar106,auVar48,auVar96);
    auVar106 = vmulps_avx512vl(auVar106,auVar106);
    auVar105 = vfmadd231ps_avx512vl(auVar106,auVar105,auVar105);
    auVar104 = vfmadd231ps_avx512vl(auVar105,auVar104,auVar104);
    auVar105 = vmulps_avx512vl(auVar95,auVar95);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar96,auVar96);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar93,auVar93);
    auVar106 = vrcp14ps_avx512vl(auVar105);
    auVar107 = vfnmadd213ps_avx512vl(auVar106,auVar105,auVar113);
    auVar106 = vfmadd132ps_avx512vl(auVar107,auVar106,auVar106);
    auVar104 = vmulps_avx512vl(auVar104,auVar106);
    auVar107 = vmulps_avx512vl(auVar96,auVar89);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar88,auVar95);
    auVar108 = vmulps_avx512vl(auVar95,auVar103);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar89,auVar93);
    auVar109 = vmulps_avx512vl(auVar93,auVar88);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar103,auVar96);
    auVar109 = vmulps_avx512vl(auVar109,auVar109);
    auVar108 = vfmadd231ps_avx512vl(auVar109,auVar108,auVar108);
    auVar107 = vfmadd231ps_avx512vl(auVar108,auVar107,auVar107);
    auVar106 = vmulps_avx512vl(auVar107,auVar106);
    auVar104 = vmaxps_avx512vl(auVar104,auVar106);
    auVar104 = vsqrtps_avx512vl(auVar104);
    auVar106 = vmaxps_avx512vl(auVar92,auVar102);
    auVar94 = vmaxps_avx512vl(auVar94,auVar106);
    auVar106 = vaddps_avx512vl(auVar104,auVar94);
    auVar94 = vminps_avx(auVar92,auVar102);
    auVar94 = vminps_avx(auVar91,auVar94);
    auVar94 = vsubps_avx512vl(auVar94,auVar104);
    auVar119._8_4_ = 0x3f800002;
    auVar119._0_8_ = 0x3f8000023f800002;
    auVar119._12_4_ = 0x3f800002;
    auVar119._16_4_ = 0x3f800002;
    auVar119._20_4_ = 0x3f800002;
    auVar119._24_4_ = 0x3f800002;
    auVar119._28_4_ = 0x3f800002;
    auVar91 = vmulps_avx512vl(auVar106,auVar119);
    auVar120._8_4_ = 0x3f7ffffc;
    auVar120._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar120._12_4_ = 0x3f7ffffc;
    auVar120._16_4_ = 0x3f7ffffc;
    auVar120._20_4_ = 0x3f7ffffc;
    auVar120._24_4_ = 0x3f7ffffc;
    auVar120._28_4_ = 0x3f7ffffc;
    local_8e0 = vmulps_avx512vl(auVar94,auVar120);
    auVar94 = vmulps_avx512vl(auVar91,auVar91);
    auVar91 = vrsqrt14ps_avx512vl(auVar105);
    auVar27._8_4_ = 0xbf000000;
    auVar27._0_8_ = 0xbf000000bf000000;
    auVar27._12_4_ = 0xbf000000;
    auVar27._16_4_ = 0xbf000000;
    auVar27._20_4_ = 0xbf000000;
    auVar27._24_4_ = 0xbf000000;
    auVar27._28_4_ = 0xbf000000;
    auVar92 = vmulps_avx512vl(auVar105,auVar27);
    fVar192 = auVar91._0_4_;
    fVar139 = auVar91._4_4_;
    fVar207 = auVar91._8_4_;
    fVar208 = auVar91._12_4_;
    fVar209 = auVar91._16_4_;
    fVar210 = auVar91._20_4_;
    fVar211 = auVar91._24_4_;
    auVar52._4_4_ = fVar139 * fVar139 * fVar139 * auVar92._4_4_;
    auVar52._0_4_ = fVar192 * fVar192 * fVar192 * auVar92._0_4_;
    auVar52._8_4_ = fVar207 * fVar207 * fVar207 * auVar92._8_4_;
    auVar52._12_4_ = fVar208 * fVar208 * fVar208 * auVar92._12_4_;
    auVar52._16_4_ = fVar209 * fVar209 * fVar209 * auVar92._16_4_;
    auVar52._20_4_ = fVar210 * fVar210 * fVar210 * auVar92._20_4_;
    auVar52._24_4_ = fVar211 * fVar211 * fVar211 * auVar92._24_4_;
    auVar52._28_4_ = auVar106._28_4_;
    auVar28._8_4_ = 0x3fc00000;
    auVar28._0_8_ = 0x3fc000003fc00000;
    auVar28._12_4_ = 0x3fc00000;
    auVar28._16_4_ = 0x3fc00000;
    auVar28._20_4_ = 0x3fc00000;
    auVar28._24_4_ = 0x3fc00000;
    auVar28._28_4_ = 0x3fc00000;
    auVar91 = vfmadd231ps_avx512vl(auVar52,auVar91,auVar28);
    auVar92 = vmulps_avx512vl(auVar93,auVar91);
    auVar102 = vmulps_avx512vl(auVar96,auVar91);
    auVar104 = vmulps_avx512vl(auVar95,auVar91);
    auVar105 = vsubps_avx512vl(auVar112,auVar98);
    auVar106 = vsubps_avx512vl(auVar112,auVar99);
    auVar107 = vsubps_avx512vl(auVar112,auVar100);
    auVar108 = vmulps_avx512vl(auVar262._0_32_,auVar107);
    local_5c0 = auVar263._0_32_;
    auVar108 = vfmadd231ps_avx512vl(auVar108,local_5c0,auVar106);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar260._0_32_,auVar105);
    auVar109 = vmulps_avx512vl(auVar107,auVar107);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar106,auVar106);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar105,auVar105);
    auVar110 = vmulps_avx512vl(auVar262._0_32_,auVar104);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar102,local_5c0);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar92,auVar260._0_32_);
    auVar104 = vmulps_avx512vl(auVar107,auVar104);
    auVar102 = vfmadd231ps_avx512vl(auVar104,auVar106,auVar102);
    auVar92 = vfmadd231ps_avx512vl(auVar102,auVar105,auVar92);
    auVar102 = vmulps_avx512vl(auVar110,auVar110);
    auVar104 = vsubps_avx512vl(local_200,auVar102);
    auVar111 = vmulps_avx512vl(auVar110,auVar92);
    auVar108 = vsubps_avx512vl(auVar108,auVar111);
    auVar108 = vaddps_avx512vl(auVar108,auVar108);
    auVar111 = vmulps_avx512vl(auVar92,auVar92);
    local_880 = vsubps_avx512vl(auVar109,auVar111);
    auVar94 = vsubps_avx512vl(local_880,auVar94);
    _local_8a0 = vmulps_avx512vl(auVar108,auVar108);
    auVar29._8_4_ = 0x40800000;
    auVar29._0_8_ = 0x4080000040800000;
    auVar29._12_4_ = 0x40800000;
    auVar29._16_4_ = 0x40800000;
    auVar29._20_4_ = 0x40800000;
    auVar29._24_4_ = 0x40800000;
    auVar29._28_4_ = 0x40800000;
    _local_640 = vmulps_avx512vl(auVar104,auVar29);
    auVar109 = vmulps_avx512vl(_local_640,auVar94);
    auVar109 = vsubps_avx512vl(_local_8a0,auVar109);
    uVar80 = vcmpps_avx512vl(auVar109,auVar112,5);
    bVar69 = (byte)uVar80;
    fVar192 = (float)local_8c0._0_4_;
    fVar139 = (float)local_8c0._4_4_;
    fVar207 = fStack_8b8;
    fVar208 = fStack_8b4;
    fVar209 = fStack_8b0;
    fVar210 = fStack_8ac;
    fVar211 = fStack_8a8;
    fVar156 = fStack_8a4;
    if (bVar69 == 0) {
LAB_01d0c793:
      auVar260 = ZEXT3264(local_620);
      auVar251 = ZEXT3264(auVar101);
      auVar262 = ZEXT3264(local_7c0);
      auVar255 = ZEXT3264(local_680);
      auVar256 = ZEXT3264(local_6a0);
      auVar257 = ZEXT3264(local_7e0);
      auVar258 = ZEXT3264(local_6c0);
      auVar259 = ZEXT3264(local_800);
      auVar261 = ZEXT3264(local_6e0);
      auVar264 = ZEXT3264(local_780);
      auVar265 = ZEXT3264(local_7a0);
      auVar266 = ZEXT3264(local_700);
      auVar267 = ZEXT3264(local_720);
      auVar269 = ZEXT3264(local_820);
    }
    else {
      auVar111 = _local_640;
      auVar109 = vsqrtps_avx512vl(auVar109);
      auVar112 = vaddps_avx512vl(auVar104,auVar104);
      local_660 = vrcp14ps_avx512vl(auVar112);
      auVar113 = vfnmadd213ps_avx512vl(local_660,auVar112,auVar113);
      auVar113 = vfmadd132ps_avx512vl(auVar113,local_660,local_660);
      auVar30._8_4_ = 0x80000000;
      auVar30._0_8_ = 0x8000000080000000;
      auVar30._12_4_ = 0x80000000;
      auVar30._16_4_ = 0x80000000;
      auVar30._20_4_ = 0x80000000;
      auVar30._24_4_ = 0x80000000;
      auVar30._28_4_ = 0x80000000;
      local_420 = vxorps_avx512vl(auVar108,auVar30);
      auVar114 = vsubps_avx512vl(local_420,auVar109);
      auVar114 = vmulps_avx512vl(auVar114,auVar113);
      auVar109 = vsubps_avx512vl(auVar109,auVar108);
      local_400 = vmulps_avx512vl(auVar109,auVar113);
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar109 = vblendmps_avx512vl(auVar109,auVar114);
      auVar115._0_4_ =
           (uint)(bVar69 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar113._0_4_;
      bVar79 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar115._4_4_ = (uint)bVar79 * auVar109._4_4_ | (uint)!bVar79 * auVar113._4_4_;
      bVar79 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar115._8_4_ = (uint)bVar79 * auVar109._8_4_ | (uint)!bVar79 * auVar113._8_4_;
      bVar79 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar115._12_4_ = (uint)bVar79 * auVar109._12_4_ | (uint)!bVar79 * auVar113._12_4_;
      bVar79 = (bool)((byte)(uVar80 >> 4) & 1);
      auVar115._16_4_ = (uint)bVar79 * auVar109._16_4_ | (uint)!bVar79 * auVar113._16_4_;
      bVar79 = (bool)((byte)(uVar80 >> 5) & 1);
      auVar115._20_4_ = (uint)bVar79 * auVar109._20_4_ | (uint)!bVar79 * auVar113._20_4_;
      bVar79 = (bool)((byte)(uVar80 >> 6) & 1);
      auVar115._24_4_ = (uint)bVar79 * auVar109._24_4_ | (uint)!bVar79 * auVar113._24_4_;
      bVar79 = SUB81(uVar80 >> 7,0);
      auVar115._28_4_ = (uint)bVar79 * auVar109._28_4_ | (uint)!bVar79 * auVar113._28_4_;
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar113 = vblendmps_avx512vl(auVar109,local_400);
      auVar116._0_4_ =
           (uint)(bVar69 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar109._0_4_;
      bVar79 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar116._4_4_ = (uint)bVar79 * auVar113._4_4_ | (uint)!bVar79 * auVar109._4_4_;
      bVar79 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar116._8_4_ = (uint)bVar79 * auVar113._8_4_ | (uint)!bVar79 * auVar109._8_4_;
      bVar79 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar116._12_4_ = (uint)bVar79 * auVar113._12_4_ | (uint)!bVar79 * auVar109._12_4_;
      bVar79 = (bool)((byte)(uVar80 >> 4) & 1);
      auVar116._16_4_ = (uint)bVar79 * auVar113._16_4_ | (uint)!bVar79 * auVar109._16_4_;
      bVar79 = (bool)((byte)(uVar80 >> 5) & 1);
      auVar116._20_4_ = (uint)bVar79 * auVar113._20_4_ | (uint)!bVar79 * auVar109._20_4_;
      bVar79 = (bool)((byte)(uVar80 >> 6) & 1);
      auVar116._24_4_ = (uint)bVar79 * auVar113._24_4_ | (uint)!bVar79 * auVar109._24_4_;
      bVar79 = SUB81(uVar80 >> 7,0);
      auVar116._28_4_ = (uint)bVar79 * auVar113._28_4_ | (uint)!bVar79 * auVar109._28_4_;
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar102,auVar109);
      local_440 = vmaxps_avx512vl(local_220,auVar109);
      auVar31._8_4_ = 0x36000000;
      auVar31._0_8_ = 0x3600000036000000;
      auVar31._12_4_ = 0x36000000;
      auVar31._16_4_ = 0x36000000;
      auVar31._20_4_ = 0x36000000;
      auVar31._24_4_ = 0x36000000;
      auVar31._28_4_ = 0x36000000;
      local_460 = vmulps_avx512vl(local_440,auVar31);
      vandps_avx512vl(auVar104,auVar109);
      uVar77 = vcmpps_avx512vl(local_460,local_460,1);
      uVar80 = uVar80 & uVar77;
      bVar73 = (byte)uVar80;
      if (bVar73 != 0) {
        uVar77 = vcmpps_avx512vl(auVar94,_DAT_01faff00,2);
        auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar102 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar104 = vblendmps_avx512vl(auVar94,auVar102);
        bVar71 = (byte)uVar77;
        uVar75 = (uint)(bVar71 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar71 & 1) * local_460._0_4_;
        bVar79 = (bool)((byte)(uVar77 >> 1) & 1);
        uVar72 = (uint)bVar79 * auVar104._4_4_ | (uint)!bVar79 * local_460._4_4_;
        bVar79 = (bool)((byte)(uVar77 >> 2) & 1);
        uVar133 = (uint)bVar79 * auVar104._8_4_ | (uint)!bVar79 * local_460._8_4_;
        bVar79 = (bool)((byte)(uVar77 >> 3) & 1);
        uVar134 = (uint)bVar79 * auVar104._12_4_ | (uint)!bVar79 * local_460._12_4_;
        bVar79 = (bool)((byte)(uVar77 >> 4) & 1);
        uVar135 = (uint)bVar79 * auVar104._16_4_ | (uint)!bVar79 * local_460._16_4_;
        bVar79 = (bool)((byte)(uVar77 >> 5) & 1);
        uVar136 = (uint)bVar79 * auVar104._20_4_ | (uint)!bVar79 * local_460._20_4_;
        bVar79 = (bool)((byte)(uVar77 >> 6) & 1);
        uVar137 = (uint)bVar79 * auVar104._24_4_ | (uint)!bVar79 * local_460._24_4_;
        bVar79 = SUB81(uVar77 >> 7,0);
        uVar138 = (uint)bVar79 * auVar104._28_4_ | (uint)!bVar79 * local_460._28_4_;
        auVar115._0_4_ = (bVar73 & 1) * uVar75 | !(bool)(bVar73 & 1) * auVar115._0_4_;
        bVar79 = (bool)((byte)(uVar80 >> 1) & 1);
        auVar115._4_4_ = bVar79 * uVar72 | !bVar79 * auVar115._4_4_;
        bVar79 = (bool)((byte)(uVar80 >> 2) & 1);
        auVar115._8_4_ = bVar79 * uVar133 | !bVar79 * auVar115._8_4_;
        bVar79 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar115._12_4_ = bVar79 * uVar134 | !bVar79 * auVar115._12_4_;
        bVar79 = (bool)((byte)(uVar80 >> 4) & 1);
        auVar115._16_4_ = bVar79 * uVar135 | !bVar79 * auVar115._16_4_;
        bVar79 = (bool)((byte)(uVar80 >> 5) & 1);
        auVar115._20_4_ = bVar79 * uVar136 | !bVar79 * auVar115._20_4_;
        bVar79 = (bool)((byte)(uVar80 >> 6) & 1);
        auVar115._24_4_ = bVar79 * uVar137 | !bVar79 * auVar115._24_4_;
        bVar79 = SUB81(uVar80 >> 7,0);
        auVar115._28_4_ = bVar79 * uVar138 | !bVar79 * auVar115._28_4_;
        auVar94 = vblendmps_avx512vl(auVar102,auVar94);
        bVar79 = (bool)((byte)(uVar77 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar77 >> 2) & 1);
        bVar8 = (bool)((byte)(uVar77 >> 3) & 1);
        bVar9 = (bool)((byte)(uVar77 >> 4) & 1);
        bVar10 = (bool)((byte)(uVar77 >> 5) & 1);
        bVar11 = (bool)((byte)(uVar77 >> 6) & 1);
        bVar12 = SUB81(uVar77 >> 7,0);
        auVar116._0_4_ =
             (uint)(bVar73 & 1) *
             ((uint)(bVar71 & 1) * auVar94._0_4_ | !(bool)(bVar71 & 1) * uVar75) |
             !(bool)(bVar73 & 1) * auVar116._0_4_;
        bVar6 = (bool)((byte)(uVar80 >> 1) & 1);
        auVar116._4_4_ =
             (uint)bVar6 * ((uint)bVar79 * auVar94._4_4_ | !bVar79 * uVar72) |
             !bVar6 * auVar116._4_4_;
        bVar79 = (bool)((byte)(uVar80 >> 2) & 1);
        auVar116._8_4_ =
             (uint)bVar79 * ((uint)bVar7 * auVar94._8_4_ | !bVar7 * uVar133) |
             !bVar79 * auVar116._8_4_;
        bVar79 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar116._12_4_ =
             (uint)bVar79 * ((uint)bVar8 * auVar94._12_4_ | !bVar8 * uVar134) |
             !bVar79 * auVar116._12_4_;
        bVar79 = (bool)((byte)(uVar80 >> 4) & 1);
        auVar116._16_4_ =
             (uint)bVar79 * ((uint)bVar9 * auVar94._16_4_ | !bVar9 * uVar135) |
             !bVar79 * auVar116._16_4_;
        bVar79 = (bool)((byte)(uVar80 >> 5) & 1);
        auVar116._20_4_ =
             (uint)bVar79 * ((uint)bVar10 * auVar94._20_4_ | !bVar10 * uVar136) |
             !bVar79 * auVar116._20_4_;
        bVar79 = (bool)((byte)(uVar80 >> 6) & 1);
        auVar116._24_4_ =
             (uint)bVar79 * ((uint)bVar11 * auVar94._24_4_ | !bVar11 * uVar137) |
             !bVar79 * auVar116._24_4_;
        bVar79 = SUB81(uVar80 >> 7,0);
        auVar116._28_4_ =
             (uint)bVar79 * ((uint)bVar12 * auVar94._28_4_ | !bVar12 * uVar138) |
             !bVar79 * auVar116._28_4_;
        bVar69 = (~bVar73 | bVar71) & bVar69;
      }
      if ((bVar69 & 0x7f) == 0) {
        auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar268 = ZEXT3264(auVar94);
        goto LAB_01d0c793;
      }
      auVar102 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar89 = vxorps_avx512vl(auVar89,auVar102);
      auVar103 = vxorps_avx512vl(auVar103,auVar102);
      auVar88 = vxorps_avx512vl(auVar88,auVar102);
      auVar83 = vsubss_avx512f(ZEXT416((uint)(ray->org).field_0.m128[3]),local_4c0);
      auVar94 = vbroadcastss_avx512vl(auVar83);
      auVar94 = vmaxps_avx512vl(auVar94,auVar115);
      auVar83 = vsubss_avx512f(ZEXT416((uint)ray->tfar),local_4c0);
      auVar104 = vbroadcastss_avx512vl(auVar83);
      auVar104 = vminps_avx512vl(auVar104,auVar116);
      auVar107 = vmulps_avx512vl(auVar107,auVar50);
      auVar106 = vfmadd213ps_avx512vl(auVar106,auVar49,auVar107);
      auVar83 = vfmadd213ps_fma(auVar105,auVar48,auVar106);
      auVar105 = vmulps_avx512vl(local_7c0,auVar50);
      auVar84 = vfmadd231ps_fma(auVar105,auVar49,local_5c0);
      auVar260 = ZEXT3264(local_620);
      auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),local_620,auVar48);
      auVar106 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar105,auVar106);
      auVar107 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar14 = vcmpps_avx512vl(auVar106,auVar107,1);
      auVar109 = vxorps_avx512vl(ZEXT1632(auVar83),auVar102);
      auVar113 = vrcp14ps_avx512vl(auVar105);
      auVar117 = vxorps_avx512vl(auVar105,auVar102);
      auVar118 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar119 = vfnmadd213ps_avx512vl(auVar113,auVar105,auVar118);
      auVar83 = vfmadd132ps_fma(auVar119,auVar113,auVar113);
      fVar191 = auVar83._0_4_ * auVar109._0_4_;
      fVar216 = auVar83._4_4_ * auVar109._4_4_;
      auVar53._4_4_ = fVar216;
      auVar53._0_4_ = fVar191;
      fVar217 = auVar83._8_4_ * auVar109._8_4_;
      auVar53._8_4_ = fVar217;
      fVar218 = auVar83._12_4_ * auVar109._12_4_;
      auVar53._12_4_ = fVar218;
      fVar219 = auVar109._16_4_ * 0.0;
      auVar53._16_4_ = fVar219;
      fVar220 = auVar109._20_4_ * 0.0;
      auVar53._20_4_ = fVar220;
      fVar221 = auVar109._24_4_ * 0.0;
      auVar53._24_4_ = fVar221;
      auVar53._28_4_ = auVar109._28_4_;
      uVar16 = vcmpps_avx512vl(auVar105,auVar117,1);
      bVar73 = (byte)uVar14 | (byte)uVar16;
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar120 = vblendmps_avx512vl(auVar53,auVar119);
      auVar121._0_4_ =
           (uint)(bVar73 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar113._0_4_;
      bVar79 = (bool)(bVar73 >> 1 & 1);
      auVar121._4_4_ = (uint)bVar79 * auVar120._4_4_ | (uint)!bVar79 * auVar113._4_4_;
      bVar79 = (bool)(bVar73 >> 2 & 1);
      auVar121._8_4_ = (uint)bVar79 * auVar120._8_4_ | (uint)!bVar79 * auVar113._8_4_;
      bVar79 = (bool)(bVar73 >> 3 & 1);
      auVar121._12_4_ = (uint)bVar79 * auVar120._12_4_ | (uint)!bVar79 * auVar113._12_4_;
      bVar79 = (bool)(bVar73 >> 4 & 1);
      auVar121._16_4_ = (uint)bVar79 * auVar120._16_4_ | (uint)!bVar79 * auVar113._16_4_;
      bVar79 = (bool)(bVar73 >> 5 & 1);
      auVar121._20_4_ = (uint)bVar79 * auVar120._20_4_ | (uint)!bVar79 * auVar113._20_4_;
      bVar79 = (bool)(bVar73 >> 6 & 1);
      auVar121._24_4_ = (uint)bVar79 * auVar120._24_4_ | (uint)!bVar79 * auVar113._24_4_;
      auVar121._28_4_ =
           (uint)(bVar73 >> 7) * auVar120._28_4_ | (uint)!(bool)(bVar73 >> 7) * auVar113._28_4_;
      auVar113 = vmaxps_avx512vl(auVar94,auVar121);
      uVar16 = vcmpps_avx512vl(auVar105,auVar117,6);
      bVar73 = (byte)uVar14 | (byte)uVar16;
      auVar105 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar122._0_4_ =
           (uint)(bVar73 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar73 & 1) * (int)fVar191;
      bVar79 = (bool)(bVar73 >> 1 & 1);
      auVar122._4_4_ = (uint)bVar79 * auVar105._4_4_ | (uint)!bVar79 * (int)fVar216;
      bVar79 = (bool)(bVar73 >> 2 & 1);
      auVar122._8_4_ = (uint)bVar79 * auVar105._8_4_ | (uint)!bVar79 * (int)fVar217;
      bVar79 = (bool)(bVar73 >> 3 & 1);
      auVar122._12_4_ = (uint)bVar79 * auVar105._12_4_ | (uint)!bVar79 * (int)fVar218;
      bVar79 = (bool)(bVar73 >> 4 & 1);
      auVar122._16_4_ = (uint)bVar79 * auVar105._16_4_ | (uint)!bVar79 * (int)fVar219;
      bVar79 = (bool)(bVar73 >> 5 & 1);
      auVar122._20_4_ = (uint)bVar79 * auVar105._20_4_ | (uint)!bVar79 * (int)fVar220;
      bVar79 = (bool)(bVar73 >> 6 & 1);
      auVar122._24_4_ = (uint)bVar79 * auVar105._24_4_ | (uint)!bVar79 * (int)fVar221;
      auVar122._28_4_ =
           (uint)(bVar73 >> 7) * auVar105._28_4_ | (uint)!(bool)(bVar73 >> 7) * auVar109._28_4_;
      auVar104 = vminps_avx512vl(auVar104,auVar122);
      auVar94 = vsubps_avx(ZEXT832(0) << 0x20,auVar97);
      auVar97 = vsubps_avx(ZEXT832(0) << 0x20,auVar90);
      auVar109 = ZEXT832(0) << 0x20;
      auVar90 = vsubps_avx(auVar109,auVar101);
      auVar90 = vmulps_avx512vl(auVar90,auVar89);
      auVar97 = vfmadd231ps_avx512vl(auVar90,auVar88,auVar97);
      auVar94 = vfmadd231ps_avx512vl(auVar97,auVar103,auVar94);
      auVar97 = vmulps_avx512vl(local_7c0,auVar89);
      auVar263 = ZEXT3264(local_5c0);
      auVar97 = vfmadd231ps_avx512vl(auVar97,local_5c0,auVar88);
      auVar97 = vfmadd231ps_avx512vl(auVar97,local_620,auVar103);
      vandps_avx512vl(auVar97,auVar106);
      uVar14 = vcmpps_avx512vl(auVar97,auVar107,1);
      auVar94 = vxorps_avx512vl(auVar94,auVar102);
      auVar90 = vrcp14ps_avx512vl(auVar97);
      auVar101 = vxorps_avx512vl(auVar97,auVar102);
      auVar102 = vfnmadd213ps_avx512vl(auVar90,auVar97,auVar118);
      auVar83 = vfmadd132ps_fma(auVar102,auVar90,auVar90);
      fVar191 = auVar83._0_4_ * auVar94._0_4_;
      fVar216 = auVar83._4_4_ * auVar94._4_4_;
      auVar54._4_4_ = fVar216;
      auVar54._0_4_ = fVar191;
      fVar217 = auVar83._8_4_ * auVar94._8_4_;
      auVar54._8_4_ = fVar217;
      fVar218 = auVar83._12_4_ * auVar94._12_4_;
      auVar54._12_4_ = fVar218;
      fVar219 = auVar94._16_4_ * 0.0;
      auVar54._16_4_ = fVar219;
      fVar220 = auVar94._20_4_ * 0.0;
      auVar54._20_4_ = fVar220;
      fVar221 = auVar94._24_4_ * 0.0;
      auVar54._24_4_ = fVar221;
      auVar54._28_4_ = auVar94._28_4_;
      uVar16 = vcmpps_avx512vl(auVar97,auVar101,1);
      bVar73 = (byte)uVar14 | (byte)uVar16;
      auVar102 = vblendmps_avx512vl(auVar54,auVar119);
      auVar123._0_4_ =
           (uint)(bVar73 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar90._0_4_;
      bVar79 = (bool)(bVar73 >> 1 & 1);
      auVar123._4_4_ = (uint)bVar79 * auVar102._4_4_ | (uint)!bVar79 * auVar90._4_4_;
      bVar79 = (bool)(bVar73 >> 2 & 1);
      auVar123._8_4_ = (uint)bVar79 * auVar102._8_4_ | (uint)!bVar79 * auVar90._8_4_;
      bVar79 = (bool)(bVar73 >> 3 & 1);
      auVar123._12_4_ = (uint)bVar79 * auVar102._12_4_ | (uint)!bVar79 * auVar90._12_4_;
      bVar79 = (bool)(bVar73 >> 4 & 1);
      auVar123._16_4_ = (uint)bVar79 * auVar102._16_4_ | (uint)!bVar79 * auVar90._16_4_;
      bVar79 = (bool)(bVar73 >> 5 & 1);
      auVar123._20_4_ = (uint)bVar79 * auVar102._20_4_ | (uint)!bVar79 * auVar90._20_4_;
      bVar79 = (bool)(bVar73 >> 6 & 1);
      auVar123._24_4_ = (uint)bVar79 * auVar102._24_4_ | (uint)!bVar79 * auVar90._24_4_;
      auVar123._28_4_ =
           (uint)(bVar73 >> 7) * auVar102._28_4_ | (uint)!(bool)(bVar73 >> 7) * auVar90._28_4_;
      _local_5a0 = vmaxps_avx(auVar113,auVar123);
      uVar16 = vcmpps_avx512vl(auVar97,auVar101,6);
      bVar73 = (byte)uVar14 | (byte)uVar16;
      auVar124._0_4_ =
           (uint)(bVar73 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar73 & 1) * (int)fVar191;
      bVar79 = (bool)(bVar73 >> 1 & 1);
      auVar124._4_4_ = (uint)bVar79 * auVar105._4_4_ | (uint)!bVar79 * (int)fVar216;
      bVar79 = (bool)(bVar73 >> 2 & 1);
      auVar124._8_4_ = (uint)bVar79 * auVar105._8_4_ | (uint)!bVar79 * (int)fVar217;
      bVar79 = (bool)(bVar73 >> 3 & 1);
      auVar124._12_4_ = (uint)bVar79 * auVar105._12_4_ | (uint)!bVar79 * (int)fVar218;
      bVar79 = (bool)(bVar73 >> 4 & 1);
      auVar124._16_4_ = (uint)bVar79 * auVar105._16_4_ | (uint)!bVar79 * (int)fVar219;
      bVar79 = (bool)(bVar73 >> 5 & 1);
      auVar124._20_4_ = (uint)bVar79 * auVar105._20_4_ | (uint)!bVar79 * (int)fVar220;
      bVar79 = (bool)(bVar73 >> 6 & 1);
      auVar124._24_4_ = (uint)bVar79 * auVar105._24_4_ | (uint)!bVar79 * (int)fVar221;
      auVar124._28_4_ =
           (uint)(bVar73 >> 7) * auVar105._28_4_ | (uint)!(bool)(bVar73 >> 7) * auVar94._28_4_;
      local_2e0 = vminps_avx(auVar104,auVar124);
      auVar243 = ZEXT3264(local_2e0);
      auVar94 = _local_5a0;
      uVar14 = vcmpps_avx512vl(_local_5a0,local_2e0,2);
      bVar69 = bVar69 & 0x7f & (byte)uVar14;
      if (bVar69 == 0) {
        auVar268 = ZEXT3264(auVar118);
        goto LAB_01d0c793;
      }
      auVar97 = vmaxps_avx(auVar109,local_8e0);
      auVar90 = vfmadd213ps_avx512vl(auVar114,auVar110,auVar92);
      auVar90 = vmulps_avx512vl(auVar91,auVar90);
      auVar102 = vfmadd213ps_avx512vl(local_400,auVar110,auVar92);
      fVar191 = auVar91._0_4_;
      fVar216 = auVar91._4_4_;
      auVar55._4_4_ = fVar216 * auVar102._4_4_;
      auVar55._0_4_ = fVar191 * auVar102._0_4_;
      fVar217 = auVar91._8_4_;
      auVar55._8_4_ = fVar217 * auVar102._8_4_;
      fVar218 = auVar91._12_4_;
      auVar55._12_4_ = fVar218 * auVar102._12_4_;
      fVar219 = auVar91._16_4_;
      auVar55._16_4_ = fVar219 * auVar102._16_4_;
      fVar220 = auVar91._20_4_;
      auVar55._20_4_ = fVar220 * auVar102._20_4_;
      fVar221 = auVar91._24_4_;
      auVar55._24_4_ = fVar221 * auVar102._24_4_;
      auVar55._28_4_ = auVar102._28_4_;
      auVar90 = vminps_avx512vl(auVar90,auVar118);
      auVar102 = SUB6432(ZEXT864(0),0) << 0x20;
      auVar90 = vmaxps_avx(auVar90,ZEXT832(0) << 0x20);
      auVar103 = vminps_avx512vl(auVar55,auVar118);
      auVar56._4_4_ = (auVar90._4_4_ + 1.0) * 0.125;
      auVar56._0_4_ = (auVar90._0_4_ + 0.0) * 0.125;
      auVar56._8_4_ = (auVar90._8_4_ + 2.0) * 0.125;
      auVar56._12_4_ = (auVar90._12_4_ + 3.0) * 0.125;
      auVar56._16_4_ = (auVar90._16_4_ + 4.0) * 0.125;
      auVar56._20_4_ = (auVar90._20_4_ + 5.0) * 0.125;
      auVar56._24_4_ = (auVar90._24_4_ + 6.0) * 0.125;
      auVar56._28_4_ = auVar90._28_4_ + 7.0;
      local_1a0 = vfmadd213ps_avx512vl(auVar56,local_500,local_4e0);
      auVar90 = vmaxps_avx(auVar103,ZEXT832(0) << 0x20);
      auVar57._4_4_ = (auVar90._4_4_ + 1.0) * 0.125;
      auVar57._0_4_ = (auVar90._0_4_ + 0.0) * 0.125;
      auVar57._8_4_ = (auVar90._8_4_ + 2.0) * 0.125;
      auVar57._12_4_ = (auVar90._12_4_ + 3.0) * 0.125;
      auVar57._16_4_ = (auVar90._16_4_ + 4.0) * 0.125;
      auVar57._20_4_ = (auVar90._20_4_ + 5.0) * 0.125;
      auVar57._24_4_ = (auVar90._24_4_ + 6.0) * 0.125;
      auVar57._28_4_ = auVar90._28_4_ + 7.0;
      local_1c0 = vfmadd213ps_avx512vl(auVar57,local_500,local_4e0);
      auVar58._4_4_ = auVar97._4_4_ * auVar97._4_4_;
      auVar58._0_4_ = auVar97._0_4_ * auVar97._0_4_;
      auVar58._8_4_ = auVar97._8_4_ * auVar97._8_4_;
      auVar58._12_4_ = auVar97._12_4_ * auVar97._12_4_;
      auVar58._16_4_ = auVar97._16_4_ * auVar97._16_4_;
      auVar58._20_4_ = auVar97._20_4_ * auVar97._20_4_;
      auVar58._24_4_ = auVar97._24_4_ * auVar97._24_4_;
      auVar58._28_4_ = auVar97._28_4_;
      auVar90 = vsubps_avx(local_880,auVar58);
      auVar59._4_4_ = auVar90._4_4_ * (float)local_640._4_4_;
      auVar59._0_4_ = auVar90._0_4_ * (float)local_640._0_4_;
      auVar59._8_4_ = auVar90._8_4_ * fStack_638;
      auVar59._12_4_ = auVar90._12_4_ * fStack_634;
      auVar59._16_4_ = auVar90._16_4_ * fStack_630;
      auVar59._20_4_ = auVar90._20_4_ * fStack_62c;
      auVar59._24_4_ = auVar90._24_4_ * fStack_628;
      auVar59._28_4_ = auVar97._28_4_;
      auVar97 = vsubps_avx(_local_8a0,auVar59);
      uVar80 = vcmpps_avx512vl(auVar97,ZEXT832(0) << 0x20,5);
      auVar268 = ZEXT3264(auVar118);
      auVar258 = ZEXT3264(local_6c0);
      auVar261 = ZEXT3264(local_6e0);
      auVar266 = ZEXT3264(local_700);
      auVar267 = ZEXT3264(local_720);
      if ((byte)uVar80 == 0) {
        uVar80 = 0;
        auVar91 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar251 = ZEXT864(0) << 0x20;
        auVar97 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar103 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar248 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar125._8_4_ = 0x7f800000;
        auVar125._0_8_ = 0x7f8000007f800000;
        auVar125._12_4_ = 0x7f800000;
        auVar125._16_4_ = 0x7f800000;
        auVar125._20_4_ = 0x7f800000;
        auVar125._24_4_ = 0x7f800000;
        auVar125._28_4_ = 0x7f800000;
        auVar126._8_4_ = 0xff800000;
        auVar126._0_8_ = 0xff800000ff800000;
        auVar126._12_4_ = 0xff800000;
        auVar126._16_4_ = 0xff800000;
        auVar126._20_4_ = 0xff800000;
        auVar126._24_4_ = 0xff800000;
        auVar126._28_4_ = 0xff800000;
      }
      else {
        auVar84 = vxorps_avx512vl(auVar141,auVar141);
        uVar77 = vcmpps_avx512vl(auVar97,auVar109,5);
        auVar97 = vsqrtps_avx(auVar97);
        auVar102 = vfnmadd213ps_avx512vl(auVar112,local_660,auVar118);
        auVar88 = vfmadd132ps_avx512vl(auVar102,local_660,local_660);
        auVar102 = vsubps_avx(local_420,auVar97);
        auVar89 = vmulps_avx512vl(auVar102,auVar88);
        auVar97 = vsubps_avx512vl(auVar97,auVar108);
        auVar88 = vmulps_avx512vl(auVar97,auVar88);
        auVar97 = vfmadd213ps_avx512vl(auVar110,auVar89,auVar92);
        auVar60._4_4_ = fVar216 * auVar97._4_4_;
        auVar60._0_4_ = fVar191 * auVar97._0_4_;
        auVar60._8_4_ = fVar217 * auVar97._8_4_;
        auVar60._12_4_ = fVar218 * auVar97._12_4_;
        auVar60._16_4_ = fVar219 * auVar97._16_4_;
        auVar60._20_4_ = fVar220 * auVar97._20_4_;
        auVar60._24_4_ = fVar221 * auVar97._24_4_;
        auVar60._28_4_ = auVar103._28_4_;
        auVar97 = vmulps_avx512vl(local_620,auVar89);
        auVar102 = vmulps_avx512vl(local_5c0,auVar89);
        auVar104 = vmulps_avx512vl(local_7c0,auVar89);
        auVar103 = vfmadd213ps_avx512vl(auVar93,auVar60,auVar98);
        auVar97 = vsubps_avx512vl(auVar97,auVar103);
        auVar103 = vfmadd213ps_avx512vl(auVar96,auVar60,auVar99);
        auVar103 = vsubps_avx512vl(auVar102,auVar103);
        auVar83 = vfmadd213ps_fma(auVar60,auVar95,auVar100);
        auVar102 = vsubps_avx(auVar104,ZEXT1632(auVar83));
        auVar248 = auVar102._0_28_;
        auVar92 = vfmadd213ps_avx512vl(auVar110,auVar88,auVar92);
        auVar61._4_4_ = fVar216 * auVar92._4_4_;
        auVar61._0_4_ = fVar191 * auVar92._0_4_;
        auVar61._8_4_ = fVar217 * auVar92._8_4_;
        auVar61._12_4_ = fVar218 * auVar92._12_4_;
        auVar61._16_4_ = fVar219 * auVar92._16_4_;
        auVar61._20_4_ = fVar220 * auVar92._20_4_;
        auVar61._24_4_ = fVar221 * auVar92._24_4_;
        auVar61._28_4_ = auVar91._28_4_;
        auVar91 = vmulps_avx512vl(local_620,auVar88);
        auVar92 = vmulps_avx512vl(local_5c0,auVar88);
        auVar104 = vmulps_avx512vl(local_7c0,auVar88);
        auVar83 = vfmadd213ps_fma(auVar93,auVar61,auVar98);
        auVar102 = vsubps_avx(auVar91,ZEXT1632(auVar83));
        auVar83 = vfmadd213ps_fma(auVar96,auVar61,auVar99);
        auVar91 = vsubps_avx(auVar92,ZEXT1632(auVar83));
        auVar83 = vfmadd213ps_fma(auVar95,auVar61,auVar100);
        auVar92 = vsubps_avx512vl(auVar104,ZEXT1632(auVar83));
        auVar251 = ZEXT3264(auVar92);
        auVar149._8_4_ = 0x7f800000;
        auVar149._0_8_ = 0x7f8000007f800000;
        auVar149._12_4_ = 0x7f800000;
        auVar149._16_4_ = 0x7f800000;
        auVar149._20_4_ = 0x7f800000;
        auVar149._24_4_ = 0x7f800000;
        auVar149._28_4_ = 0x7f800000;
        auVar92 = vblendmps_avx512vl(auVar149,auVar89);
        bVar79 = (bool)((byte)uVar77 & 1);
        auVar125._0_4_ = (uint)bVar79 * auVar92._0_4_ | (uint)!bVar79 * 0x7f800000;
        bVar79 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar125._4_4_ = (uint)bVar79 * auVar92._4_4_ | (uint)!bVar79 * 0x7f800000;
        bVar79 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar125._8_4_ = (uint)bVar79 * auVar92._8_4_ | (uint)!bVar79 * 0x7f800000;
        bVar79 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar125._12_4_ = (uint)bVar79 * auVar92._12_4_ | (uint)!bVar79 * 0x7f800000;
        bVar79 = (bool)((byte)(uVar77 >> 4) & 1);
        auVar125._16_4_ = (uint)bVar79 * auVar92._16_4_ | (uint)!bVar79 * 0x7f800000;
        bVar79 = (bool)((byte)(uVar77 >> 5) & 1);
        auVar125._20_4_ = (uint)bVar79 * auVar92._20_4_ | (uint)!bVar79 * 0x7f800000;
        bVar79 = (bool)((byte)(uVar77 >> 6) & 1);
        auVar125._24_4_ = (uint)bVar79 * auVar92._24_4_ | (uint)!bVar79 * 0x7f800000;
        bVar79 = SUB81(uVar77 >> 7,0);
        auVar125._28_4_ = (uint)bVar79 * auVar92._28_4_ | (uint)!bVar79 * 0x7f800000;
        auVar186._8_4_ = 0xff800000;
        auVar186._0_8_ = 0xff800000ff800000;
        auVar186._12_4_ = 0xff800000;
        auVar186._16_4_ = 0xff800000;
        auVar186._20_4_ = 0xff800000;
        auVar186._24_4_ = 0xff800000;
        auVar186._28_4_ = 0xff800000;
        auVar92 = vblendmps_avx512vl(auVar186,auVar88);
        bVar79 = (bool)((byte)uVar77 & 1);
        auVar126._0_4_ = (uint)bVar79 * auVar92._0_4_ | (uint)!bVar79 * -0x800000;
        bVar79 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar126._4_4_ = (uint)bVar79 * auVar92._4_4_ | (uint)!bVar79 * -0x800000;
        bVar79 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar126._8_4_ = (uint)bVar79 * auVar92._8_4_ | (uint)!bVar79 * -0x800000;
        bVar79 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar126._12_4_ = (uint)bVar79 * auVar92._12_4_ | (uint)!bVar79 * -0x800000;
        bVar79 = (bool)((byte)(uVar77 >> 4) & 1);
        auVar126._16_4_ = (uint)bVar79 * auVar92._16_4_ | (uint)!bVar79 * -0x800000;
        bVar79 = (bool)((byte)(uVar77 >> 5) & 1);
        auVar126._20_4_ = (uint)bVar79 * auVar92._20_4_ | (uint)!bVar79 * -0x800000;
        bVar79 = (bool)((byte)(uVar77 >> 6) & 1);
        auVar126._24_4_ = (uint)bVar79 * auVar92._24_4_ | (uint)!bVar79 * -0x800000;
        bVar79 = SUB81(uVar77 >> 7,0);
        auVar126._28_4_ = (uint)bVar79 * auVar92._28_4_ | (uint)!bVar79 * -0x800000;
        auVar32._8_4_ = 0x36000000;
        auVar32._0_8_ = 0x3600000036000000;
        auVar32._12_4_ = 0x36000000;
        auVar32._16_4_ = 0x36000000;
        auVar32._20_4_ = 0x36000000;
        auVar32._24_4_ = 0x36000000;
        auVar32._28_4_ = 0x36000000;
        auVar92 = vmulps_avx512vl(local_440,auVar32);
        uVar15 = vcmpps_avx512vl(auVar92,local_460,0xe);
        uVar77 = uVar77 & uVar15;
        bVar73 = (byte)uVar77;
        if (bVar73 != 0) {
          uVar15 = vcmpps_avx512vl(auVar90,ZEXT1632(auVar84),2);
          auVar237._8_4_ = 0x7f800000;
          auVar237._0_8_ = 0x7f8000007f800000;
          auVar237._12_4_ = 0x7f800000;
          auVar237._16_4_ = 0x7f800000;
          auVar237._20_4_ = 0x7f800000;
          auVar237._24_4_ = 0x7f800000;
          auVar237._28_4_ = 0x7f800000;
          auVar252._8_4_ = 0xff800000;
          auVar252._0_8_ = 0xff800000ff800000;
          auVar252._12_4_ = 0xff800000;
          auVar252._16_4_ = 0xff800000;
          auVar252._20_4_ = 0xff800000;
          auVar252._24_4_ = 0xff800000;
          auVar252._28_4_ = 0xff800000;
          auVar93 = vblendmps_avx512vl(auVar237,auVar252);
          bVar71 = (byte)uVar15;
          uVar75 = (uint)(bVar71 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar92._0_4_;
          bVar79 = (bool)((byte)(uVar15 >> 1) & 1);
          uVar72 = (uint)bVar79 * auVar93._4_4_ | (uint)!bVar79 * auVar92._4_4_;
          bVar79 = (bool)((byte)(uVar15 >> 2) & 1);
          uVar133 = (uint)bVar79 * auVar93._8_4_ | (uint)!bVar79 * auVar92._8_4_;
          bVar79 = (bool)((byte)(uVar15 >> 3) & 1);
          uVar134 = (uint)bVar79 * auVar93._12_4_ | (uint)!bVar79 * auVar92._12_4_;
          bVar79 = (bool)((byte)(uVar15 >> 4) & 1);
          uVar135 = (uint)bVar79 * auVar93._16_4_ | (uint)!bVar79 * auVar92._16_4_;
          bVar79 = (bool)((byte)(uVar15 >> 5) & 1);
          uVar136 = (uint)bVar79 * auVar93._20_4_ | (uint)!bVar79 * auVar92._20_4_;
          bVar79 = (bool)((byte)(uVar15 >> 6) & 1);
          uVar137 = (uint)bVar79 * auVar93._24_4_ | (uint)!bVar79 * auVar92._24_4_;
          bVar79 = SUB81(uVar15 >> 7,0);
          uVar138 = (uint)bVar79 * auVar93._28_4_ | (uint)!bVar79 * auVar92._28_4_;
          auVar125._0_4_ = (bVar73 & 1) * uVar75 | !(bool)(bVar73 & 1) * auVar125._0_4_;
          bVar79 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar125._4_4_ = bVar79 * uVar72 | !bVar79 * auVar125._4_4_;
          bVar79 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar125._8_4_ = bVar79 * uVar133 | !bVar79 * auVar125._8_4_;
          bVar79 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar125._12_4_ = bVar79 * uVar134 | !bVar79 * auVar125._12_4_;
          bVar79 = (bool)((byte)(uVar77 >> 4) & 1);
          auVar125._16_4_ = bVar79 * uVar135 | !bVar79 * auVar125._16_4_;
          bVar79 = (bool)((byte)(uVar77 >> 5) & 1);
          auVar125._20_4_ = bVar79 * uVar136 | !bVar79 * auVar125._20_4_;
          bVar79 = (bool)((byte)(uVar77 >> 6) & 1);
          auVar125._24_4_ = bVar79 * uVar137 | !bVar79 * auVar125._24_4_;
          bVar79 = SUB81(uVar77 >> 7,0);
          auVar125._28_4_ = bVar79 * uVar138 | !bVar79 * auVar125._28_4_;
          auVar92 = vblendmps_avx512vl(auVar252,auVar237);
          bVar79 = (bool)((byte)(uVar15 >> 1) & 1);
          bVar7 = (bool)((byte)(uVar15 >> 2) & 1);
          bVar8 = (bool)((byte)(uVar15 >> 3) & 1);
          bVar9 = (bool)((byte)(uVar15 >> 4) & 1);
          bVar10 = (bool)((byte)(uVar15 >> 5) & 1);
          bVar11 = (bool)((byte)(uVar15 >> 6) & 1);
          bVar12 = SUB81(uVar15 >> 7,0);
          auVar126._0_4_ =
               (uint)(bVar73 & 1) *
               ((uint)(bVar71 & 1) * auVar92._0_4_ | !(bool)(bVar71 & 1) * uVar75) |
               !(bool)(bVar73 & 1) * auVar126._0_4_;
          bVar6 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar126._4_4_ =
               (uint)bVar6 * ((uint)bVar79 * auVar92._4_4_ | !bVar79 * uVar72) |
               !bVar6 * auVar126._4_4_;
          bVar79 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar126._8_4_ =
               (uint)bVar79 * ((uint)bVar7 * auVar92._8_4_ | !bVar7 * uVar133) |
               !bVar79 * auVar126._8_4_;
          bVar79 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar126._12_4_ =
               (uint)bVar79 * ((uint)bVar8 * auVar92._12_4_ | !bVar8 * uVar134) |
               !bVar79 * auVar126._12_4_;
          bVar79 = (bool)((byte)(uVar77 >> 4) & 1);
          auVar126._16_4_ =
               (uint)bVar79 * ((uint)bVar9 * auVar92._16_4_ | !bVar9 * uVar135) |
               !bVar79 * auVar126._16_4_;
          bVar79 = (bool)((byte)(uVar77 >> 5) & 1);
          auVar126._20_4_ =
               (uint)bVar79 * ((uint)bVar10 * auVar92._20_4_ | !bVar10 * uVar136) |
               !bVar79 * auVar126._20_4_;
          bVar79 = (bool)((byte)(uVar77 >> 6) & 1);
          auVar126._24_4_ =
               (uint)bVar79 * ((uint)bVar11 * auVar92._24_4_ | !bVar11 * uVar137) |
               !bVar79 * auVar126._24_4_;
          bVar79 = SUB81(uVar77 >> 7,0);
          auVar126._28_4_ =
               (uint)bVar79 * ((uint)bVar12 * auVar92._28_4_ | !bVar12 * uVar138) |
               !bVar79 * auVar126._28_4_;
          uVar80 = (ulong)(byte)((~bVar73 | bVar71) & (byte)uVar80);
        }
      }
      auVar265 = ZEXT3264(local_7a0);
      auVar264 = ZEXT3264(local_780);
      auVar262 = ZEXT3264(local_7c0);
      auVar259 = ZEXT3264(local_800);
      auVar257 = ZEXT3264(local_7e0);
      auVar269 = ZEXT3264(local_820);
      uVar140 = *(undefined4 *)&(ray->dir).field_0;
      auVar227._4_4_ = uVar140;
      auVar227._0_4_ = uVar140;
      auVar227._8_4_ = uVar140;
      auVar227._12_4_ = uVar140;
      auVar227._16_4_ = uVar140;
      auVar227._20_4_ = uVar140;
      auVar227._24_4_ = uVar140;
      auVar227._28_4_ = uVar140;
      uVar140 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
      auVar236._4_4_ = uVar140;
      auVar236._0_4_ = uVar140;
      auVar236._8_4_ = uVar140;
      auVar236._12_4_ = uVar140;
      auVar236._16_4_ = uVar140;
      auVar236._20_4_ = uVar140;
      auVar236._24_4_ = uVar140;
      auVar236._28_4_ = uVar140;
      auVar238 = ZEXT3264(auVar236);
      fVar191 = (ray->dir).field_0.m128[2];
      auVar255._0_4_ = fVar191 * auVar251._0_4_;
      auVar255._4_4_ = fVar191 * auVar251._4_4_;
      auVar255._8_4_ = fVar191 * auVar251._8_4_;
      auVar255._12_4_ = fVar191 * auVar251._12_4_;
      auVar255._16_4_ = fVar191 * auVar251._16_4_;
      auVar255._20_4_ = fVar191 * auVar251._20_4_;
      auVar255._28_36_ = auVar251._28_36_;
      auVar255._24_4_ = fVar191 * auVar251._24_4_;
      auVar83 = vfmadd231ps_fma(auVar255._0_32_,auVar236,auVar91);
      auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar227,auVar102);
      auVar250._8_4_ = 0x7fffffff;
      auVar250._0_8_ = 0x7fffffff7fffffff;
      auVar250._12_4_ = 0x7fffffff;
      auVar250._16_4_ = 0x7fffffff;
      auVar250._20_4_ = 0x7fffffff;
      auVar250._24_4_ = 0x7fffffff;
      auVar250._28_4_ = 0x7fffffff;
      auVar251 = ZEXT3264(auVar250);
      auVar91 = vandps_avx(auVar250,ZEXT1632(auVar83));
      _local_2c0 = _local_5a0;
      auVar226._8_4_ = 0x3e99999a;
      auVar226._0_8_ = 0x3e99999a3e99999a;
      auVar226._12_4_ = 0x3e99999a;
      auVar226._16_4_ = 0x3e99999a;
      auVar226._20_4_ = 0x3e99999a;
      auVar226._24_4_ = 0x3e99999a;
      auVar226._28_4_ = 0x3e99999a;
      uVar14 = vcmpps_avx512vl(auVar91,auVar226,1);
      local_8ea = (short)uVar14;
      local_3e0 = vmaxps_avx(_local_5a0,auVar126);
      local_300 = local_3e0;
      auVar91 = vminps_avx(local_2e0,auVar125);
      uVar14 = vcmpps_avx512vl(_local_5a0,auVar91,2);
      bVar73 = (byte)uVar14 & bVar69;
      uVar16 = vcmpps_avx512vl(local_3e0,local_2e0,2);
      auVar255 = ZEXT3264(local_680);
      auVar256 = ZEXT3264(local_6a0);
      if ((bVar69 & ((byte)uVar16 | (byte)uVar14)) != 0) {
        auVar62._4_4_ = auVar248._4_4_ * fVar191;
        auVar62._0_4_ = auVar248._0_4_ * fVar191;
        auVar62._8_4_ = auVar248._8_4_ * fVar191;
        auVar62._12_4_ = auVar248._12_4_ * fVar191;
        auVar62._16_4_ = auVar248._16_4_ * fVar191;
        auVar62._20_4_ = auVar248._20_4_ * fVar191;
        auVar62._24_4_ = auVar248._24_4_ * fVar191;
        auVar62._28_4_ = auVar91._28_4_;
        auVar83 = vfmadd213ps_fma(auVar103,auVar236,auVar62);
        auVar83 = vfmadd213ps_fma(auVar97,auVar227,ZEXT1632(auVar83));
        auVar91 = vandps_avx(auVar250,ZEXT1632(auVar83));
        uVar14 = vcmpps_avx512vl(auVar91,auVar226,1);
        local_828 = (int)CONCAT71((int7)(uVar80 >> 8),~(byte)uVar80);
        bVar71 = (byte)uVar14 | ~(byte)uVar80;
        auVar152._8_4_ = 2;
        auVar152._0_8_ = 0x200000002;
        auVar152._12_4_ = 2;
        auVar152._16_4_ = 2;
        auVar152._20_4_ = 2;
        auVar152._24_4_ = 2;
        auVar152._28_4_ = 2;
        auVar33._8_4_ = 3;
        auVar33._0_8_ = 0x300000003;
        auVar33._12_4_ = 3;
        auVar33._16_4_ = 3;
        auVar33._20_4_ = 3;
        auVar33._24_4_ = 3;
        auVar33._28_4_ = 3;
        auVar91 = vpblendmd_avx512vl(auVar152,auVar33);
        local_280._0_4_ = (uint)(bVar71 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar71 & 1) * 2;
        bVar79 = (bool)(bVar71 >> 1 & 1);
        local_280._4_4_ = (uint)bVar79 * auVar91._4_4_ | (uint)!bVar79 * 2;
        bVar79 = (bool)(bVar71 >> 2 & 1);
        local_280._8_4_ = (uint)bVar79 * auVar91._8_4_ | (uint)!bVar79 * 2;
        bVar79 = (bool)(bVar71 >> 3 & 1);
        local_280._12_4_ = (uint)bVar79 * auVar91._12_4_ | (uint)!bVar79 * 2;
        bVar79 = (bool)(bVar71 >> 4 & 1);
        local_280._16_4_ = (uint)bVar79 * auVar91._16_4_ | (uint)!bVar79 * 2;
        bVar79 = (bool)(bVar71 >> 5 & 1);
        local_280._20_4_ = (uint)bVar79 * auVar91._20_4_ | (uint)!bVar79 * 2;
        bVar79 = (bool)(bVar71 >> 6 & 1);
        local_280._24_4_ = (uint)bVar79 * auVar91._24_4_ | (uint)!bVar79 * 2;
        local_280._28_4_ = (uint)(bVar71 >> 7) * auVar91._28_4_ | (uint)!(bool)(bVar71 >> 7) * 2;
        local_380 = vpbroadcastd_avx512vl();
        uVar14 = vpcmpd_avx512vl(local_380,local_280,5);
        local_824 = (uint)bVar73;
        bVar73 = (byte)uVar14 & bVar73;
        _local_640 = auVar111;
        if (bVar73 == 0) {
          fVar191 = ray->tfar;
          auVar154._4_4_ = fVar191;
          auVar154._0_4_ = fVar191;
          auVar154._8_4_ = fVar191;
          auVar154._12_4_ = fVar191;
          auVar154._16_4_ = fVar191;
          auVar154._20_4_ = fVar191;
          auVar154._24_4_ = fVar191;
          auVar154._28_4_ = fVar191;
        }
        else {
          auVar84 = vminps_avx(local_520._0_16_,local_560._0_16_);
          auVar83 = vmaxps_avx(local_520._0_16_,local_560._0_16_);
          auVar81 = vminps_avx(local_540._0_16_,local_580._0_16_);
          auVar87 = vminps_avx(auVar84,auVar81);
          auVar84 = vmaxps_avx(local_540._0_16_,local_580._0_16_);
          auVar81 = vmaxps_avx(auVar83,auVar84);
          auVar171._8_4_ = 0x7fffffff;
          auVar171._0_8_ = 0x7fffffff7fffffff;
          auVar171._12_4_ = 0x7fffffff;
          auVar83 = vandps_avx(auVar87,auVar171);
          auVar84 = vandps_avx(auVar81,auVar171);
          auVar83 = vmaxps_avx(auVar83,auVar84);
          auVar84 = vmovshdup_avx(auVar83);
          auVar84 = vmaxss_avx(auVar84,auVar83);
          auVar83 = vshufpd_avx(auVar83,auVar83,1);
          auVar83 = vmaxss_avx(auVar83,auVar84);
          fVar191 = auVar83._0_4_ * 1.9073486e-06;
          local_4b0 = vshufps_avx(auVar81,auVar81,0xff);
          local_3c0 = (float)local_5a0._0_4_ + (float)local_8c0._0_4_;
          fStack_3bc = (float)local_5a0._4_4_ + (float)local_8c0._4_4_;
          fStack_3b8 = fStack_598 + fStack_8b8;
          fStack_3b4 = fStack_594 + fStack_8b4;
          fStack_3b0 = fStack_590 + fStack_8b0;
          fStack_3ac = fStack_58c + fStack_8ac;
          fStack_3a8 = fStack_588 + fStack_8a8;
          fStack_3a4 = fStack_584 + fStack_8a4;
          _local_5a0 = auVar94;
          do {
            auVar92 = local_8e0;
            auVar153._8_4_ = 0x7f800000;
            auVar153._0_8_ = 0x7f8000007f800000;
            auVar153._12_4_ = 0x7f800000;
            auVar153._16_4_ = 0x7f800000;
            auVar153._20_4_ = 0x7f800000;
            auVar153._24_4_ = 0x7f800000;
            auVar153._28_4_ = 0x7f800000;
            auVar94 = vblendmps_avx512vl(auVar153,_local_5a0);
            auVar128._0_4_ =
                 (uint)(bVar73 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar73 & 1) * 0x7f800000;
            bVar79 = (bool)(bVar73 >> 1 & 1);
            auVar128._4_4_ = (uint)bVar79 * auVar94._4_4_ | (uint)!bVar79 * 0x7f800000;
            bVar79 = (bool)(bVar73 >> 2 & 1);
            auVar128._8_4_ = (uint)bVar79 * auVar94._8_4_ | (uint)!bVar79 * 0x7f800000;
            bVar79 = (bool)(bVar73 >> 3 & 1);
            auVar128._12_4_ = (uint)bVar79 * auVar94._12_4_ | (uint)!bVar79 * 0x7f800000;
            bVar79 = (bool)(bVar73 >> 4 & 1);
            auVar128._16_4_ = (uint)bVar79 * auVar94._16_4_ | (uint)!bVar79 * 0x7f800000;
            bVar79 = (bool)(bVar73 >> 5 & 1);
            auVar128._20_4_ = (uint)bVar79 * auVar94._20_4_ | (uint)!bVar79 * 0x7f800000;
            bVar79 = (bool)(bVar73 >> 6 & 1);
            auVar128._24_4_ = (uint)bVar79 * auVar94._24_4_ | (uint)!bVar79 * 0x7f800000;
            auVar128._28_4_ =
                 (uint)(bVar73 >> 7) * auVar94._28_4_ | (uint)!(bool)(bVar73 >> 7) * 0x7f800000;
            auVar94 = vshufps_avx(auVar128,auVar128,0xb1);
            auVar94 = vminps_avx(auVar128,auVar94);
            auVar91 = vshufpd_avx(auVar94,auVar94,5);
            auVar94 = vminps_avx(auVar94,auVar91);
            auVar91 = vpermpd_avx2(auVar94,0x4e);
            auVar94 = vminps_avx(auVar94,auVar91);
            uVar14 = vcmpps_avx512vl(auVar128,auVar94,0);
            bVar70 = (byte)uVar14 & bVar73;
            bVar71 = bVar73;
            if (bVar70 != 0) {
              bVar71 = bVar70;
            }
            iVar18 = 0;
            for (uVar75 = (uint)bVar71; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x80000000) {
              iVar18 = iVar18 + 1;
            }
            aVar1 = (ray->dir).field_0;
            local_4e0._0_16_ = (undefined1  [16])aVar1;
            auVar83 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
            if (auVar83._0_4_ < 0.0) {
              local_8e0[1] = 0;
              local_8e0[0] = bVar73;
              local_8e0._2_30_ = auVar92._2_30_;
              local_880._0_16_ = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar18 << 2)));
              _local_8a0 = ZEXT416(*(uint *)(local_2c0 + (uint)(iVar18 << 2)));
              fVar216 = sqrtf(auVar83._0_4_);
              bVar73 = local_8e0[0];
              auVar83 = _local_8a0;
              auVar84 = local_880._0_16_;
            }
            else {
              auVar83 = vsqrtss_avx(auVar83,auVar83);
              fVar216 = auVar83._0_4_;
              auVar83 = ZEXT416(*(uint *)(local_2c0 + (uint)(iVar18 << 2)));
              auVar84 = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar18 << 2)));
            }
            auVar83 = vinsertps_avx(auVar83,auVar84,0x10);
            bVar79 = true;
            uVar80 = 0;
            do {
              uVar140 = auVar83._0_4_;
              auVar143._4_4_ = uVar140;
              auVar143._0_4_ = uVar140;
              auVar143._8_4_ = uVar140;
              auVar143._12_4_ = uVar140;
              auVar81 = vfmadd132ps_fma(auVar143,ZEXT816(0) << 0x40,local_4e0._0_16_);
              auVar84 = vmovshdup_avx(auVar83);
              fVar209 = auVar84._0_4_;
              fVar210 = 1.0 - fVar209;
              fVar192 = fVar209 * fVar209;
              auVar241 = SUB6416(ZEXT464(0x40400000),0);
              auVar233 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar82 = vfmadd213ss_fma(auVar241,auVar84,auVar233);
              auVar87 = vfmadd213ss_fma(auVar82,ZEXT416((uint)fVar192),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar85 = vfmadd213ss_fma(auVar241,ZEXT416((uint)fVar210),auVar233);
              auVar85 = vfmadd213ss_fma(auVar85,ZEXT416((uint)(fVar210 * fVar210)),
                                        SUB6416(ZEXT464(0x40000000),0));
              fVar139 = fVar210 * fVar210 * -fVar209 * 0.5;
              fVar207 = auVar87._0_4_ * 0.5;
              fVar208 = auVar85._0_4_ * 0.5;
              fVar209 = fVar209 * fVar209 * -fVar210 * 0.5;
              auVar193._0_4_ = fVar209 * (float)local_580._0_4_;
              auVar193._4_4_ = fVar209 * (float)local_580._4_4_;
              auVar193._8_4_ = fVar209 * fStack_578;
              auVar193._12_4_ = fVar209 * fStack_574;
              auVar212._4_4_ = fVar208;
              auVar212._0_4_ = fVar208;
              auVar212._8_4_ = fVar208;
              auVar212._12_4_ = fVar208;
              auVar87 = vfmadd132ps_fma(auVar212,auVar193,local_540._0_16_);
              auVar172._4_4_ = fVar207;
              auVar172._0_4_ = fVar207;
              auVar172._8_4_ = fVar207;
              auVar172._12_4_ = fVar207;
              auVar87 = vfmadd132ps_fma(auVar172,auVar87,local_560._0_16_);
              auVar194._4_4_ = fVar139;
              auVar194._0_4_ = fVar139;
              auVar194._8_4_ = fVar139;
              auVar194._12_4_ = fVar139;
              auVar87 = vfmadd132ps_fma(auVar194,auVar87,local_520._0_16_);
              auVar85 = vfmadd231ss_fma(auVar233,auVar84,ZEXT416(0x41100000));
              local_420._0_16_ = auVar85;
              auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar84,ZEXT416(0x40800000));
              local_440._0_16_ = auVar85;
              local_8e0._0_16_ = auVar84;
              auVar84 = vfmadd213ss_fma(auVar241,auVar84,ZEXT416(0xbf800000));
              local_460._0_16_ = auVar84;
              local_400._0_16_ = auVar87;
              auVar84 = vsubps_avx(auVar81,auVar87);
              local_880._0_16_ = auVar84;
              auVar84 = vdpps_avx(auVar84,auVar84,0x7f);
              _local_8a0 = auVar84;
              local_500._0_16_ = auVar83;
              if (auVar84._0_4_ < 0.0) {
                local_640._0_4_ = auVar82._0_4_;
                local_660._0_16_ = ZEXT416((uint)fVar210);
                local_840._0_4_ = fVar192;
                local_850._0_4_ = fVar210 * -2.0;
                auVar268._0_4_ = sqrtf(auVar84._0_4_);
                auVar268._4_60_ = extraout_var;
                auVar82 = ZEXT416((uint)local_640._0_4_);
                auVar83 = auVar268._0_16_;
                auVar84 = local_660._0_16_;
              }
              else {
                auVar83 = vsqrtss_avx(auVar84,auVar84);
                local_850._0_4_ = fVar210 * -2.0;
                local_840._0_4_ = fVar192;
                auVar84 = ZEXT416((uint)fVar210);
              }
              fVar139 = auVar84._0_4_;
              fVar192 = local_8e0._0_4_;
              auVar85 = vfnmadd231ss_fma(ZEXT416((uint)(fVar192 * (fVar139 + fVar139))),auVar84,
                                         auVar84);
              auVar84 = vfmadd213ss_fma(auVar82,ZEXT416((uint)(fVar192 + fVar192)),
                                        ZEXT416((uint)(fVar192 * fVar192 * 3.0)));
              auVar81 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_8e0._0_16_,
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar87 = vfmadd231ss_fma(ZEXT416((uint)(fVar139 * fVar139 * -3.0)),
                                        ZEXT416((uint)(fVar139 + fVar139)),auVar81);
              auVar81 = vfmadd213ss_fma(ZEXT416((uint)local_850._0_4_),local_8e0._0_16_,
                                        ZEXT416((uint)local_840._0_4_));
              fVar192 = auVar85._0_4_ * 0.5;
              fVar139 = auVar84._0_4_ * 0.5;
              fVar207 = auVar87._0_4_ * 0.5;
              fVar208 = auVar81._0_4_ * 0.5;
              auVar195._0_4_ = fVar208 * (float)local_580._0_4_;
              auVar195._4_4_ = fVar208 * (float)local_580._4_4_;
              auVar195._8_4_ = fVar208 * fStack_578;
              auVar195._12_4_ = fVar208 * fStack_574;
              auVar173._4_4_ = fVar207;
              auVar173._0_4_ = fVar207;
              auVar173._8_4_ = fVar207;
              auVar173._12_4_ = fVar207;
              auVar84 = vfmadd132ps_fma(auVar173,auVar195,local_540._0_16_);
              auVar157._4_4_ = fVar139;
              auVar157._0_4_ = fVar139;
              auVar157._8_4_ = fVar139;
              auVar157._12_4_ = fVar139;
              auVar84 = vfmadd132ps_fma(auVar157,auVar84,local_560._0_16_);
              auVar253._4_4_ = fVar192;
              auVar253._0_4_ = fVar192;
              auVar253._8_4_ = fVar192;
              auVar253._12_4_ = fVar192;
              _local_640 = vfmadd132ps_fma(auVar253,auVar84,local_520._0_16_);
              local_840 = vdpps_avx(_local_640,_local_640,0x7f);
              auVar63._12_4_ = 0;
              auVar63._0_12_ = ZEXT812(0);
              fVar192 = local_840._0_4_;
              local_860 = vrsqrt14ss_avx512f(auVar63 << 0x20,ZEXT416((uint)fVar192));
              fVar139 = local_860._0_4_;
              local_850 = vrcp14ss_avx512f(auVar63 << 0x20,ZEXT416((uint)fVar192));
              auVar19._8_4_ = 0x80000000;
              auVar19._0_8_ = 0x8000000080000000;
              auVar19._12_4_ = 0x80000000;
              auVar81 = vxorps_avx512vl(local_840,auVar19);
              auVar84 = vfnmadd213ss_fma(local_850,local_840,SUB6416(ZEXT464(0x40000000),0));
              local_660._0_4_ = auVar83._0_4_;
              if (fVar192 < auVar81._0_4_) {
                fVar207 = sqrtf(fVar192);
                auVar83 = ZEXT416((uint)local_660._0_4_);
                auVar81 = _local_640;
              }
              else {
                auVar81 = vsqrtss_avx(local_840,local_840);
                fVar207 = auVar81._0_4_;
                auVar81 = _local_640;
              }
              fVar208 = local_860._0_4_;
              fVar192 = fVar139 * 1.5 + fVar192 * -0.5 * fVar208 * fVar208 * fVar208;
              local_860._0_4_ = auVar81._0_4_ * fVar192;
              local_860._4_4_ = auVar81._4_4_ * fVar192;
              local_860._8_4_ = auVar81._8_4_ * fVar192;
              local_860._12_4_ = auVar81._12_4_ * fVar192;
              auVar87 = vdpps_avx(local_880._0_16_,local_860,0x7f);
              fVar208 = auVar83._0_4_;
              auVar144._0_4_ = auVar87._0_4_ * auVar87._0_4_;
              auVar144._4_4_ = auVar87._4_4_ * auVar87._4_4_;
              auVar144._8_4_ = auVar87._8_4_ * auVar87._8_4_;
              auVar144._12_4_ = auVar87._12_4_ * auVar87._12_4_;
              auVar82 = vsubps_avx512vl(_local_8a0,auVar144);
              fVar139 = auVar82._0_4_;
              auVar158._4_12_ = ZEXT812(0) << 0x20;
              auVar158._0_4_ = fVar139;
              auVar85 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar158);
              if (fVar139 < 0.0) {
                local_4a0 = fVar192;
                fStack_49c = fVar192;
                fStack_498 = fVar192;
                fStack_494 = fVar192;
                local_490 = auVar85;
                local_480 = auVar87;
                fVar217 = sqrtf(fVar139);
                auVar83 = ZEXT416((uint)local_660._0_4_);
                auVar82 = local_490;
                auVar81 = _local_640;
                auVar87 = local_480;
                fVar192 = local_4a0;
                fVar209 = fStack_49c;
                fVar210 = fStack_498;
                fVar211 = fStack_494;
              }
              else {
                auVar82 = vsqrtss_avx(auVar82,auVar82);
                fVar217 = auVar82._0_4_;
                auVar82 = auVar85;
                fVar209 = fVar192;
                fVar210 = fVar192;
                fVar211 = fVar192;
              }
              auVar251 = ZEXT1664(local_880._0_16_);
              auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar268 = ZEXT3264(auVar94);
              auVar260 = ZEXT3264(local_620);
              auVar263 = ZEXT3264(local_5c0);
              auVar262 = ZEXT3264(local_7c0);
              auVar255 = ZEXT3264(local_680);
              auVar256 = ZEXT3264(local_6a0);
              auVar257 = ZEXT3264(local_7e0);
              auVar258 = ZEXT3264(local_6c0);
              auVar259 = ZEXT3264(local_800);
              auVar261 = ZEXT3264(local_6e0);
              auVar264 = ZEXT3264(local_780);
              auVar265 = ZEXT3264(local_7a0);
              auVar266 = ZEXT3264(local_700);
              auVar267 = ZEXT3264(local_720);
              auVar269 = ZEXT3264(local_820);
              auVar159._0_4_ = (float)local_460._0_4_ * (float)local_580._0_4_;
              auVar159._4_4_ = (float)local_460._0_4_ * (float)local_580._4_4_;
              auVar159._8_4_ = (float)local_460._0_4_ * fStack_578;
              auVar159._12_4_ = (float)local_460._0_4_ * fStack_574;
              auVar174._4_4_ = local_440._0_4_;
              auVar174._0_4_ = local_440._0_4_;
              auVar174._8_4_ = local_440._0_4_;
              auVar174._12_4_ = local_440._0_4_;
              auVar233 = vfmadd132ps_fma(auVar174,auVar159,local_540._0_16_);
              auVar160._4_4_ = local_420._0_4_;
              auVar160._0_4_ = local_420._0_4_;
              auVar160._8_4_ = local_420._0_4_;
              auVar160._12_4_ = local_420._0_4_;
              auVar233 = vfmadd132ps_fma(auVar160,auVar233,local_560._0_16_);
              auVar241 = vfmadd213ss_fma(local_8e0._0_16_,SUB6416(ZEXT464(0xc0400000),0),
                                         ZEXT416(0x40000000));
              uVar140 = auVar241._0_4_;
              auVar175._4_4_ = uVar140;
              auVar175._0_4_ = uVar140;
              auVar175._8_4_ = uVar140;
              auVar175._12_4_ = uVar140;
              auVar233 = vfmadd132ps_fma(auVar175,auVar233,local_520._0_16_);
              auVar161._0_4_ = auVar233._0_4_ * (float)local_840._0_4_;
              auVar161._4_4_ = auVar233._4_4_ * (float)local_840._0_4_;
              auVar161._8_4_ = auVar233._8_4_ * (float)local_840._0_4_;
              auVar161._12_4_ = auVar233._12_4_ * (float)local_840._0_4_;
              auVar233 = vdpps_avx(auVar81,auVar233,0x7f);
              fVar156 = auVar233._0_4_;
              auVar176._0_4_ = auVar81._0_4_ * fVar156;
              auVar176._4_4_ = auVar81._4_4_ * fVar156;
              auVar176._8_4_ = auVar81._8_4_ * fVar156;
              auVar176._12_4_ = auVar81._12_4_ * fVar156;
              auVar241 = vsubps_avx(auVar161,auVar176);
              fVar156 = auVar84._0_4_ * (float)local_850._0_4_;
              auVar233 = vmaxss_avx(ZEXT416((uint)fVar191),
                                    ZEXT416((uint)(local_500._0_4_ * fVar216 * 1.9073486e-06)));
              auVar20._8_4_ = 0x80000000;
              auVar20._0_8_ = 0x8000000080000000;
              auVar20._12_4_ = 0x80000000;
              auVar129._16_16_ = local_820._16_16_;
              auVar86 = vxorps_avx512vl(auVar81,auVar20);
              auVar177._0_4_ = fVar192 * auVar241._0_4_ * fVar156;
              auVar177._4_4_ = fVar209 * auVar241._4_4_ * fVar156;
              auVar177._8_4_ = fVar210 * auVar241._8_4_ * fVar156;
              auVar177._12_4_ = fVar211 * auVar241._12_4_ * fVar156;
              auVar84 = vdpps_avx(auVar86,local_860,0x7f);
              auVar241 = vfmadd213ss_fma(auVar83,ZEXT416((uint)fVar191),auVar233);
              auVar83 = vdpps_avx(local_880._0_16_,auVar177,0x7f);
              auVar241 = vfmadd213ss_fma(ZEXT416((uint)(fVar208 + 1.0)),
                                         ZEXT416((uint)(fVar191 / fVar207)),auVar241);
              fVar192 = auVar84._0_4_ + auVar83._0_4_;
              auVar83 = vdpps_avx(local_4e0._0_16_,local_860,0x7f);
              auVar84 = vdpps_avx(local_880._0_16_,auVar86,0x7f);
              fVar207 = auVar82._0_4_;
              fVar139 = auVar85._0_4_ * 1.5 + fVar207 * fVar139 * -0.5 * fVar207 * fVar207;
              auVar82 = vdpps_avx(local_880._0_16_,local_4e0._0_16_,0x7f);
              auVar86 = vfnmadd231ss_fma(auVar84,auVar87,ZEXT416((uint)fVar192));
              auVar82 = vfnmadd231ss_fma(auVar82,auVar87,auVar83);
              auVar84 = vpermilps_avx(local_400._0_16_,0xff);
              fVar217 = fVar217 - auVar84._0_4_;
              auVar85 = vshufps_avx(auVar81,auVar81,0xff);
              auVar84 = vfmsub213ss_fma(auVar86,ZEXT416((uint)fVar139),auVar85);
              auVar242._8_4_ = 0x80000000;
              auVar242._0_8_ = 0x8000000080000000;
              auVar242._12_4_ = 0x80000000;
              auVar243 = ZEXT1664(auVar242);
              auVar234._0_8_ = auVar84._0_8_ ^ 0x8000000080000000;
              auVar234._8_4_ = auVar84._8_4_ ^ 0x80000000;
              auVar234._12_4_ = auVar84._12_4_ ^ 0x80000000;
              auVar82 = ZEXT416((uint)(auVar82._0_4_ * fVar139));
              auVar86 = vfmsub231ss_fma(ZEXT416((uint)(auVar83._0_4_ * auVar84._0_4_)),
                                        ZEXT416((uint)fVar192),auVar82);
              auVar84 = vinsertps_avx(auVar234,auVar82,0x1c);
              auVar224._0_8_ = auVar83._0_8_ ^ 0x8000000080000000;
              auVar224._8_4_ = auVar83._8_4_ ^ 0x80000000;
              auVar224._12_4_ = auVar83._12_4_ ^ 0x80000000;
              auVar82 = vinsertps_avx(ZEXT416((uint)fVar192),auVar224,0x10);
              auVar196._0_4_ = auVar86._0_4_;
              auVar196._4_4_ = auVar196._0_4_;
              auVar196._8_4_ = auVar196._0_4_;
              auVar196._12_4_ = auVar196._0_4_;
              auVar83 = vdivps_avx(auVar84,auVar196);
              auVar84 = vdivps_avx(auVar82,auVar196);
              fVar192 = auVar87._0_4_;
              auVar197._0_4_ = fVar192 * auVar83._0_4_ + fVar217 * auVar84._0_4_;
              auVar197._4_4_ = fVar192 * auVar83._4_4_ + fVar217 * auVar84._4_4_;
              auVar197._8_4_ = fVar192 * auVar83._8_4_ + fVar217 * auVar84._8_4_;
              auVar197._12_4_ = fVar192 * auVar83._12_4_ + fVar217 * auVar84._12_4_;
              auVar83 = vsubps_avx(local_500._0_16_,auVar197);
              auVar21._8_4_ = 0x7fffffff;
              auVar21._0_8_ = 0x7fffffff7fffffff;
              auVar21._12_4_ = 0x7fffffff;
              auVar84 = vandps_avx512vl(auVar87,auVar21);
              fVar192 = (float)local_8c0._0_4_;
              fVar139 = (float)local_8c0._4_4_;
              fVar207 = fStack_8b8;
              fVar208 = fStack_8b4;
              fVar209 = fStack_8b0;
              fVar210 = fStack_8ac;
              fVar211 = fStack_8a8;
              fVar156 = fStack_8a4;
              if (auVar84._0_4_ < auVar241._0_4_) {
                auVar84 = vfmadd231ss_fma(ZEXT416((uint)(auVar241._0_4_ + auVar233._0_4_)),local_4b0
                                          ,ZEXT416(0x36000000));
                auVar22._8_4_ = 0x7fffffff;
                auVar22._0_8_ = 0x7fffffff7fffffff;
                auVar22._12_4_ = 0x7fffffff;
                auVar87 = vandps_avx512vl(ZEXT416((uint)fVar217),auVar22);
                if (auVar87._0_4_ < auVar84._0_4_) {
                  fVar216 = auVar83._0_4_ + (float)local_4c0._0_4_;
                  bVar71 = 0;
                  if (((ray->org).field_0.m128[3] <= fVar216) && (bVar71 = 0, fVar216 <= ray->tfar))
                  {
                    auVar83 = vmovshdup_avx(auVar83);
                    bVar71 = 0;
                    fVar217 = auVar83._0_4_;
                    if ((0.0 <= fVar217) && (fVar217 <= 1.0)) {
                      auVar64._12_4_ = 0;
                      auVar64._0_12_ = ZEXT412(0);
                      auVar129._4_12_ = ZEXT412(0);
                      auVar129._0_4_ = local_8a0._0_4_;
                      auVar83 = vrsqrt14ss_avx512f(auVar64 << 0x20,auVar129._0_16_);
                      fVar218 = auVar83._0_4_;
                      auVar83 = vmulss_avx512f(_local_8a0,ZEXT416(0xbf000000));
                      pGVar4 = (context->scene->geometries).items[local_8e8].ptr;
                      if ((pGVar4->mask & ray->mask) == 0) {
                        bVar71 = 0;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (bVar71 = 1, pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        local_8e0._0_4_ = ray->tfar;
                        fVar192 = fVar218 * 1.5 + auVar83._0_4_ * fVar218 * fVar218 * fVar218;
                        auVar198._0_4_ = local_880._0_4_ * fVar192;
                        auVar198._4_4_ = local_880._4_4_ * fVar192;
                        auVar198._8_4_ = local_880._8_4_ * fVar192;
                        auVar198._12_4_ = local_880._12_4_ * fVar192;
                        auVar87 = vfmadd213ps_fma(auVar85,auVar198,auVar81);
                        auVar83 = vshufps_avx(auVar198,auVar198,0xc9);
                        auVar84 = vshufps_avx(auVar81,auVar81,0xc9);
                        auVar199._0_4_ = auVar198._0_4_ * auVar84._0_4_;
                        auVar199._4_4_ = auVar198._4_4_ * auVar84._4_4_;
                        auVar199._8_4_ = auVar198._8_4_ * auVar84._8_4_;
                        auVar199._12_4_ = auVar198._12_4_ * auVar84._12_4_;
                        auVar81 = vfmsub231ps_fma(auVar199,auVar81,auVar83);
                        auVar83 = vshufps_avx(auVar81,auVar81,0xc9);
                        auVar84 = vshufps_avx(auVar87,auVar87,0xc9);
                        auVar81 = vshufps_avx(auVar81,auVar81,0xd2);
                        auVar145._0_4_ = auVar87._0_4_ * auVar81._0_4_;
                        auVar145._4_4_ = auVar87._4_4_ * auVar81._4_4_;
                        auVar145._8_4_ = auVar87._8_4_ * auVar81._8_4_;
                        auVar145._12_4_ = auVar87._12_4_ * auVar81._12_4_;
                        auVar84 = vfmsub231ps_fma(auVar145,auVar83,auVar84);
                        auVar83 = vshufps_avx(auVar84,auVar84,0xe9);
                        local_600 = vmovlps_avx(auVar83);
                        local_5f8 = auVar84._0_4_;
                        local_5f4 = fVar217;
                        local_5f0 = 0;
                        local_5ec = (int)local_5c8;
                        local_5e8 = (int)local_8e8;
                        local_5e4 = context->user->instID[0];
                        local_5e0 = context->user->instPrimID[0];
                        ray->tfar = fVar216;
                        local_8f0 = -1;
                        local_750.valid = &local_8f0;
                        local_750.geometryUserPtr = pGVar4->userPtr;
                        local_750.context = context->user;
                        local_750.ray = (RTCRayN *)ray;
                        local_750.hit = (RTCHitN *)&local_600;
                        local_750.N = 1;
                        if (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01d0d4d6:
                          p_Var5 = context->args->filter;
                          if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar243 = ZEXT1664(auVar243._0_16_);
                            auVar251 = ZEXT1664(auVar251._0_16_);
                            (*p_Var5)(&local_750);
                            if (*local_750.valid == 0) goto LAB_01d0d52c;
                          }
                          bVar71 = 1;
                        }
                        else {
                          auVar243 = ZEXT1664(auVar242);
                          auVar251 = ZEXT1664(local_880._0_16_);
                          (*pGVar4->occlusionFilterN)(&local_750);
                          if (*local_750.valid != 0) goto LAB_01d0d4d6;
LAB_01d0d52c:
                          ray->tfar = (float)local_8e0._0_4_;
                          bVar71 = 0;
                        }
                        auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar268 = ZEXT3264(auVar94);
                        auVar260 = ZEXT3264(local_620);
                        auVar263 = ZEXT3264(local_5c0);
                        auVar262 = ZEXT3264(local_7c0);
                        auVar255 = ZEXT3264(local_680);
                        auVar256 = ZEXT3264(local_6a0);
                        auVar257 = ZEXT3264(local_7e0);
                        auVar258 = ZEXT3264(local_6c0);
                        auVar259 = ZEXT3264(local_800);
                        auVar261 = ZEXT3264(local_6e0);
                        auVar264 = ZEXT3264(local_780);
                        auVar265 = ZEXT3264(local_7a0);
                        auVar266 = ZEXT3264(local_700);
                        auVar267 = ZEXT3264(local_720);
                        auVar269 = ZEXT3264(local_820);
                        fVar192 = (float)local_8c0._0_4_;
                        fVar139 = (float)local_8c0._4_4_;
                        fVar207 = fStack_8b8;
                        fVar208 = fStack_8b4;
                        fVar209 = fStack_8b0;
                        fVar210 = fStack_8ac;
                        fVar211 = fStack_8a8;
                        fVar156 = fStack_8a4;
                      }
                    }
                  }
                  goto LAB_01d0d2cc;
                }
              }
              bVar79 = uVar80 < 4;
              uVar80 = uVar80 + 1;
            } while (uVar80 != 5);
            bVar79 = false;
            bVar71 = 5;
LAB_01d0d2cc:
            bVar78 = (bool)(bVar78 | bVar79 & bVar71);
            fVar216 = ray->tfar;
            auVar154._4_4_ = fVar216;
            auVar154._0_4_ = fVar216;
            auVar154._8_4_ = fVar216;
            auVar154._12_4_ = fVar216;
            auVar154._16_4_ = fVar216;
            auVar154._20_4_ = fVar216;
            auVar154._24_4_ = fVar216;
            auVar154._28_4_ = fVar216;
            auVar67._4_4_ = fStack_3bc;
            auVar67._0_4_ = local_3c0;
            auVar67._8_4_ = fStack_3b8;
            auVar67._12_4_ = fStack_3b4;
            auVar67._16_4_ = fStack_3b0;
            auVar67._20_4_ = fStack_3ac;
            auVar67._24_4_ = fStack_3a8;
            auVar67._28_4_ = fStack_3a4;
            uVar14 = vcmpps_avx512vl(auVar154,auVar67,0xd);
            bVar73 = ~('\x01' << ((byte)iVar18 & 0x1f)) & bVar73 & (byte)uVar14;
          } while (bVar73 != 0);
        }
        auVar238 = ZEXT3264(local_300);
        bVar73 = (byte)local_8ea | (byte)local_828;
        auVar169._0_4_ = fVar192 + local_3e0._0_4_;
        auVar169._4_4_ = fVar139 + local_3e0._4_4_;
        auVar169._8_4_ = fVar207 + local_3e0._8_4_;
        auVar169._12_4_ = fVar208 + local_3e0._12_4_;
        auVar169._16_4_ = fVar209 + local_3e0._16_4_;
        auVar169._20_4_ = fVar210 + local_3e0._20_4_;
        auVar169._24_4_ = fVar211 + local_3e0._24_4_;
        auVar169._28_4_ = fVar156 + local_3e0._28_4_;
        uVar14 = vcmpps_avx512vl(auVar169,auVar154,2);
        bVar69 = (byte)uVar16 & bVar69 & (byte)uVar14;
        auVar170._8_4_ = 2;
        auVar170._0_8_ = 0x200000002;
        auVar170._12_4_ = 2;
        auVar170._16_4_ = 2;
        auVar170._20_4_ = 2;
        auVar170._24_4_ = 2;
        auVar170._28_4_ = 2;
        auVar34._8_4_ = 3;
        auVar34._0_8_ = 0x300000003;
        auVar34._12_4_ = 3;
        auVar34._16_4_ = 3;
        auVar34._20_4_ = 3;
        auVar34._24_4_ = 3;
        auVar34._28_4_ = 3;
        auVar94 = vpblendmd_avx512vl(auVar170,auVar34);
        local_3e0._0_4_ = (uint)(bVar73 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar73 & 1) * 2;
        bVar79 = (bool)(bVar73 >> 1 & 1);
        local_3e0._4_4_ = (uint)bVar79 * auVar94._4_4_ | (uint)!bVar79 * 2;
        bVar79 = (bool)(bVar73 >> 2 & 1);
        local_3e0._8_4_ = (uint)bVar79 * auVar94._8_4_ | (uint)!bVar79 * 2;
        bVar79 = (bool)(bVar73 >> 3 & 1);
        local_3e0._12_4_ = (uint)bVar79 * auVar94._12_4_ | (uint)!bVar79 * 2;
        bVar79 = (bool)(bVar73 >> 4 & 1);
        local_3e0._16_4_ = (uint)bVar79 * auVar94._16_4_ | (uint)!bVar79 * 2;
        bVar79 = (bool)(bVar73 >> 5 & 1);
        local_3e0._20_4_ = (uint)bVar79 * auVar94._20_4_ | (uint)!bVar79 * 2;
        bVar79 = (bool)(bVar73 >> 6 & 1);
        local_3e0._24_4_ = (uint)bVar79 * auVar94._24_4_ | (uint)!bVar79 * 2;
        local_3e0._28_4_ = (uint)(bVar73 >> 7) * auVar94._28_4_ | (uint)!(bool)(bVar73 >> 7) * 2;
        uVar14 = vpcmpd_avx512vl(local_380,local_3e0,5);
        bVar73 = (byte)uVar14 & bVar69;
        if (bVar73 != 0) {
          auVar84 = vminps_avx(local_520._0_16_,local_560._0_16_);
          auVar83 = vmaxps_avx(local_520._0_16_,local_560._0_16_);
          auVar81 = vminps_avx(local_540._0_16_,local_580._0_16_);
          auVar87 = vminps_avx(auVar84,auVar81);
          auVar84 = vmaxps_avx(local_540._0_16_,local_580._0_16_);
          auVar81 = vmaxps_avx(auVar83,auVar84);
          auVar178._8_4_ = 0x7fffffff;
          auVar178._0_8_ = 0x7fffffff7fffffff;
          auVar178._12_4_ = 0x7fffffff;
          auVar83 = vandps_avx(auVar87,auVar178);
          auVar84 = vandps_avx(auVar81,auVar178);
          auVar83 = vmaxps_avx(auVar83,auVar84);
          auVar84 = vmovshdup_avx(auVar83);
          auVar84 = vmaxss_avx(auVar84,auVar83);
          auVar83 = vshufpd_avx(auVar83,auVar83,1);
          auVar83 = vmaxss_avx(auVar83,auVar84);
          fVar191 = auVar83._0_4_ * 1.9073486e-06;
          local_4b0 = vshufps_avx(auVar81,auVar81,0xff);
          local_3c0 = fVar192 + local_300._0_4_;
          fStack_3bc = fVar139 + local_300._4_4_;
          fStack_3b8 = fVar207 + local_300._8_4_;
          fStack_3b4 = fVar208 + local_300._12_4_;
          fStack_3b0 = fVar209 + local_300._16_4_;
          fStack_3ac = fVar210 + local_300._20_4_;
          fStack_3a8 = fVar211 + local_300._24_4_;
          fStack_3a4 = fVar156 + local_300._28_4_;
          _local_5a0 = local_300;
          do {
            auVar92 = local_8e0;
            auVar155._8_4_ = 0x7f800000;
            auVar155._0_8_ = 0x7f8000007f800000;
            auVar155._12_4_ = 0x7f800000;
            auVar155._16_4_ = 0x7f800000;
            auVar155._20_4_ = 0x7f800000;
            auVar155._24_4_ = 0x7f800000;
            auVar155._28_4_ = 0x7f800000;
            auVar94 = vblendmps_avx512vl(auVar155,auVar238._0_32_);
            auVar130._0_4_ =
                 (uint)(bVar73 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar73 & 1) * 0x7f800000;
            bVar79 = (bool)(bVar73 >> 1 & 1);
            auVar130._4_4_ = (uint)bVar79 * auVar94._4_4_ | (uint)!bVar79 * 0x7f800000;
            bVar79 = (bool)(bVar73 >> 2 & 1);
            auVar130._8_4_ = (uint)bVar79 * auVar94._8_4_ | (uint)!bVar79 * 0x7f800000;
            bVar79 = (bool)(bVar73 >> 3 & 1);
            auVar130._12_4_ = (uint)bVar79 * auVar94._12_4_ | (uint)!bVar79 * 0x7f800000;
            bVar79 = (bool)(bVar73 >> 4 & 1);
            auVar130._16_4_ = (uint)bVar79 * auVar94._16_4_ | (uint)!bVar79 * 0x7f800000;
            bVar79 = (bool)(bVar73 >> 5 & 1);
            auVar130._20_4_ = (uint)bVar79 * auVar94._20_4_ | (uint)!bVar79 * 0x7f800000;
            bVar79 = (bool)(bVar73 >> 6 & 1);
            auVar130._24_4_ = (uint)bVar79 * auVar94._24_4_ | (uint)!bVar79 * 0x7f800000;
            auVar130._28_4_ =
                 (uint)(bVar73 >> 7) * auVar94._28_4_ | (uint)!(bool)(bVar73 >> 7) * 0x7f800000;
            auVar94 = vshufps_avx(auVar130,auVar130,0xb1);
            auVar94 = vminps_avx(auVar130,auVar94);
            auVar91 = vshufpd_avx(auVar94,auVar94,5);
            auVar94 = vminps_avx(auVar94,auVar91);
            auVar91 = vpermpd_avx2(auVar94,0x4e);
            auVar94 = vminps_avx(auVar94,auVar91);
            uVar14 = vcmpps_avx512vl(auVar130,auVar94,0);
            bVar70 = (byte)uVar14 & bVar73;
            bVar71 = bVar73;
            if (bVar70 != 0) {
              bVar71 = bVar70;
            }
            iVar18 = 0;
            for (uVar75 = (uint)bVar71; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x80000000) {
              iVar18 = iVar18 + 1;
            }
            aVar1 = (ray->dir).field_0;
            local_4e0._0_16_ = (undefined1  [16])aVar1;
            auVar83 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
            if (auVar83._0_4_ < 0.0) {
              local_8e0[1] = 0;
              local_8e0[0] = bVar73;
              local_8e0._2_30_ = auVar92._2_30_;
              local_880._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar18 << 2)));
              _local_8a0 = ZEXT416(*(uint *)(local_2e0 + (uint)(iVar18 << 2)));
              fVar192 = sqrtf(auVar83._0_4_);
              bVar73 = local_8e0[0];
              auVar83 = _local_8a0;
              auVar84 = local_880._0_16_;
            }
            else {
              auVar83 = vsqrtss_avx(auVar83,auVar83);
              fVar192 = auVar83._0_4_;
              auVar83 = ZEXT416(*(uint *)(local_2e0 + (uint)(iVar18 << 2)));
              auVar84 = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar18 << 2)));
            }
            auVar83 = vinsertps_avx(auVar83,auVar84,0x10);
            bVar79 = true;
            uVar80 = 0;
            do {
              uVar140 = auVar83._0_4_;
              auVar146._4_4_ = uVar140;
              auVar146._0_4_ = uVar140;
              auVar146._8_4_ = uVar140;
              auVar146._12_4_ = uVar140;
              auVar81 = vfmadd132ps_fma(auVar146,ZEXT816(0) << 0x40,local_4e0._0_16_);
              auVar84 = vmovshdup_avx(auVar83);
              fVar210 = auVar84._0_4_;
              fVar211 = 1.0 - fVar210;
              fVar139 = fVar210 * fVar210;
              auVar241 = SUB6416(ZEXT464(0x40400000),0);
              auVar233 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar82 = vfmadd213ss_fma(auVar241,auVar84,auVar233);
              auVar87 = vfmadd213ss_fma(auVar82,ZEXT416((uint)fVar139),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar85 = vfmadd213ss_fma(auVar241,ZEXT416((uint)fVar211),auVar233);
              auVar85 = vfmadd213ss_fma(auVar85,ZEXT416((uint)(fVar211 * fVar211)),
                                        SUB6416(ZEXT464(0x40000000),0));
              fVar207 = fVar211 * fVar211 * -fVar210 * 0.5;
              fVar208 = auVar87._0_4_ * 0.5;
              fVar209 = auVar85._0_4_ * 0.5;
              fVar210 = fVar210 * fVar210 * -fVar211 * 0.5;
              auVar200._0_4_ = fVar210 * (float)local_580._0_4_;
              auVar200._4_4_ = fVar210 * (float)local_580._4_4_;
              auVar200._8_4_ = fVar210 * fStack_578;
              auVar200._12_4_ = fVar210 * fStack_574;
              auVar213._4_4_ = fVar209;
              auVar213._0_4_ = fVar209;
              auVar213._8_4_ = fVar209;
              auVar213._12_4_ = fVar209;
              auVar87 = vfmadd132ps_fma(auVar213,auVar200,local_540._0_16_);
              auVar179._4_4_ = fVar208;
              auVar179._0_4_ = fVar208;
              auVar179._8_4_ = fVar208;
              auVar179._12_4_ = fVar208;
              auVar87 = vfmadd132ps_fma(auVar179,auVar87,local_560._0_16_);
              auVar201._4_4_ = fVar207;
              auVar201._0_4_ = fVar207;
              auVar201._8_4_ = fVar207;
              auVar201._12_4_ = fVar207;
              auVar87 = vfmadd132ps_fma(auVar201,auVar87,local_520._0_16_);
              auVar85 = vfmadd231ss_fma(auVar233,auVar84,ZEXT416(0x41100000));
              local_420._0_16_ = auVar85;
              auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar84,ZEXT416(0x40800000));
              local_440._0_16_ = auVar85;
              local_8e0._0_16_ = auVar84;
              auVar84 = vfmadd213ss_fma(auVar241,auVar84,ZEXT416(0xbf800000));
              local_460._0_16_ = auVar84;
              local_400._0_16_ = auVar87;
              auVar84 = vsubps_avx(auVar81,auVar87);
              local_880._0_16_ = auVar84;
              auVar84 = vdpps_avx(auVar84,auVar84,0x7f);
              _local_8a0 = auVar84;
              local_500._0_16_ = auVar83;
              if (auVar84._0_4_ < 0.0) {
                local_640._0_4_ = auVar82._0_4_;
                local_660._0_16_ = ZEXT416((uint)fVar211);
                local_840._0_4_ = fVar139;
                local_850._0_4_ = fVar211 * -2.0;
                auVar251._0_4_ = sqrtf(auVar84._0_4_);
                auVar251._4_60_ = extraout_var_00;
                auVar82 = ZEXT416((uint)local_640._0_4_);
                auVar83 = auVar251._0_16_;
                auVar84 = local_660._0_16_;
              }
              else {
                auVar83 = vsqrtss_avx(auVar84,auVar84);
                local_850._0_4_ = fVar211 * -2.0;
                local_840._0_4_ = fVar139;
                auVar84 = ZEXT416((uint)fVar211);
              }
              fVar207 = auVar84._0_4_;
              fVar139 = local_8e0._0_4_;
              auVar85 = vfnmadd231ss_fma(ZEXT416((uint)(fVar139 * (fVar207 + fVar207))),auVar84,
                                         auVar84);
              auVar84 = vfmadd213ss_fma(auVar82,ZEXT416((uint)(fVar139 + fVar139)),
                                        ZEXT416((uint)(fVar139 * fVar139 * 3.0)));
              auVar81 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_8e0._0_16_,
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar87 = vfmadd231ss_fma(ZEXT416((uint)(fVar207 * fVar207 * -3.0)),
                                        ZEXT416((uint)(fVar207 + fVar207)),auVar81);
              auVar81 = vfmadd213ss_fma(ZEXT416((uint)local_850._0_4_),local_8e0._0_16_,
                                        ZEXT416((uint)local_840._0_4_));
              fVar139 = auVar85._0_4_ * 0.5;
              fVar207 = auVar84._0_4_ * 0.5;
              fVar208 = auVar87._0_4_ * 0.5;
              fVar209 = auVar81._0_4_ * 0.5;
              auVar202._0_4_ = fVar209 * (float)local_580._0_4_;
              auVar202._4_4_ = fVar209 * (float)local_580._4_4_;
              auVar202._8_4_ = fVar209 * fStack_578;
              auVar202._12_4_ = fVar209 * fStack_574;
              auVar180._4_4_ = fVar208;
              auVar180._0_4_ = fVar208;
              auVar180._8_4_ = fVar208;
              auVar180._12_4_ = fVar208;
              auVar84 = vfmadd132ps_fma(auVar180,auVar202,local_540._0_16_);
              auVar162._4_4_ = fVar207;
              auVar162._0_4_ = fVar207;
              auVar162._8_4_ = fVar207;
              auVar162._12_4_ = fVar207;
              auVar84 = vfmadd132ps_fma(auVar162,auVar84,local_560._0_16_);
              auVar254._4_4_ = fVar139;
              auVar254._0_4_ = fVar139;
              auVar254._8_4_ = fVar139;
              auVar254._12_4_ = fVar139;
              _local_640 = vfmadd132ps_fma(auVar254,auVar84,local_520._0_16_);
              local_840 = vdpps_avx(_local_640,_local_640,0x7f);
              auVar65._12_4_ = 0;
              auVar65._0_12_ = ZEXT812(0);
              fVar139 = local_840._0_4_;
              local_860 = vrsqrt14ss_avx512f(auVar65 << 0x20,ZEXT416((uint)fVar139));
              fVar207 = local_860._0_4_;
              local_850 = vrcp14ss_avx512f(auVar65 << 0x20,ZEXT416((uint)fVar139));
              auVar23._8_4_ = 0x80000000;
              auVar23._0_8_ = 0x8000000080000000;
              auVar23._12_4_ = 0x80000000;
              auVar81 = vxorps_avx512vl(local_840,auVar23);
              auVar84 = vfnmadd213ss_fma(local_850,local_840,SUB6416(ZEXT464(0x40000000),0));
              local_660._0_4_ = auVar83._0_4_;
              if (fVar139 < auVar81._0_4_) {
                fVar208 = sqrtf(fVar139);
                auVar83 = ZEXT416((uint)local_660._0_4_);
                auVar81 = _local_640;
              }
              else {
                auVar81 = vsqrtss_avx(local_840,local_840);
                fVar208 = auVar81._0_4_;
                auVar81 = _local_640;
              }
              fVar209 = local_860._0_4_;
              fVar139 = fVar207 * 1.5 + fVar139 * -0.5 * fVar209 * fVar209 * fVar209;
              local_860._0_4_ = auVar81._0_4_ * fVar139;
              local_860._4_4_ = auVar81._4_4_ * fVar139;
              local_860._8_4_ = auVar81._8_4_ * fVar139;
              local_860._12_4_ = auVar81._12_4_ * fVar139;
              auVar87 = vdpps_avx(local_880._0_16_,local_860,0x7f);
              fVar209 = auVar83._0_4_;
              auVar147._0_4_ = auVar87._0_4_ * auVar87._0_4_;
              auVar147._4_4_ = auVar87._4_4_ * auVar87._4_4_;
              auVar147._8_4_ = auVar87._8_4_ * auVar87._8_4_;
              auVar147._12_4_ = auVar87._12_4_ * auVar87._12_4_;
              auVar82 = vsubps_avx512vl(_local_8a0,auVar147);
              fVar207 = auVar82._0_4_;
              auVar163._4_12_ = ZEXT812(0) << 0x20;
              auVar163._0_4_ = fVar207;
              auVar85 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar163);
              if (fVar207 < 0.0) {
                local_4a0 = fVar139;
                fStack_49c = fVar139;
                fStack_498 = fVar139;
                fStack_494 = fVar139;
                local_490 = auVar85;
                local_480 = auVar87;
                fVar210 = sqrtf(fVar207);
                auVar83 = ZEXT416((uint)local_660._0_4_);
                auVar82 = local_490;
                auVar81 = _local_640;
                auVar87 = local_480;
                fVar139 = local_4a0;
                fVar211 = fStack_49c;
                fVar156 = fStack_498;
                fVar216 = fStack_494;
              }
              else {
                auVar82 = vsqrtss_avx(auVar82,auVar82);
                fVar210 = auVar82._0_4_;
                auVar82 = auVar85;
                fVar211 = fVar139;
                fVar156 = fVar139;
                fVar216 = fVar139;
              }
              auVar251 = ZEXT1664(local_880._0_16_);
              auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar268 = ZEXT3264(auVar94);
              auVar260 = ZEXT3264(local_620);
              auVar263 = ZEXT3264(local_5c0);
              auVar262 = ZEXT3264(local_7c0);
              auVar255 = ZEXT3264(local_680);
              auVar256 = ZEXT3264(local_6a0);
              auVar257 = ZEXT3264(local_7e0);
              auVar258 = ZEXT3264(local_6c0);
              auVar259 = ZEXT3264(local_800);
              auVar261 = ZEXT3264(local_6e0);
              auVar264 = ZEXT3264(local_780);
              auVar265 = ZEXT3264(local_7a0);
              auVar266 = ZEXT3264(local_700);
              auVar267 = ZEXT3264(local_720);
              auVar269 = ZEXT3264(local_820);
              auVar164._0_4_ = (float)local_460._0_4_ * (float)local_580._0_4_;
              auVar164._4_4_ = (float)local_460._0_4_ * (float)local_580._4_4_;
              auVar164._8_4_ = (float)local_460._0_4_ * fStack_578;
              auVar164._12_4_ = (float)local_460._0_4_ * fStack_574;
              auVar181._4_4_ = local_440._0_4_;
              auVar181._0_4_ = local_440._0_4_;
              auVar181._8_4_ = local_440._0_4_;
              auVar181._12_4_ = local_440._0_4_;
              auVar233 = vfmadd132ps_fma(auVar181,auVar164,local_540._0_16_);
              auVar165._4_4_ = local_420._0_4_;
              auVar165._0_4_ = local_420._0_4_;
              auVar165._8_4_ = local_420._0_4_;
              auVar165._12_4_ = local_420._0_4_;
              auVar233 = vfmadd132ps_fma(auVar165,auVar233,local_560._0_16_);
              auVar241 = vfmadd213ss_fma(local_8e0._0_16_,SUB6416(ZEXT464(0xc0400000),0),
                                         ZEXT416(0x40000000));
              uVar140 = auVar241._0_4_;
              auVar182._4_4_ = uVar140;
              auVar182._0_4_ = uVar140;
              auVar182._8_4_ = uVar140;
              auVar182._12_4_ = uVar140;
              auVar233 = vfmadd132ps_fma(auVar182,auVar233,local_520._0_16_);
              auVar166._0_4_ = auVar233._0_4_ * (float)local_840._0_4_;
              auVar166._4_4_ = auVar233._4_4_ * (float)local_840._0_4_;
              auVar166._8_4_ = auVar233._8_4_ * (float)local_840._0_4_;
              auVar166._12_4_ = auVar233._12_4_ * (float)local_840._0_4_;
              auVar233 = vdpps_avx(auVar81,auVar233,0x7f);
              fVar217 = auVar233._0_4_;
              auVar183._0_4_ = auVar81._0_4_ * fVar217;
              auVar183._4_4_ = auVar81._4_4_ * fVar217;
              auVar183._8_4_ = auVar81._8_4_ * fVar217;
              auVar183._12_4_ = auVar81._12_4_ * fVar217;
              auVar241 = vsubps_avx(auVar166,auVar183);
              fVar217 = auVar84._0_4_ * (float)local_850._0_4_;
              auVar233 = vmaxss_avx(ZEXT416((uint)fVar191),
                                    ZEXT416((uint)(local_500._0_4_ * fVar192 * 1.9073486e-06)));
              auVar24._8_4_ = 0x80000000;
              auVar24._0_8_ = 0x8000000080000000;
              auVar24._12_4_ = 0x80000000;
              auVar131._16_16_ = local_820._16_16_;
              auVar86 = vxorps_avx512vl(auVar81,auVar24);
              auVar184._0_4_ = fVar139 * auVar241._0_4_ * fVar217;
              auVar184._4_4_ = fVar211 * auVar241._4_4_ * fVar217;
              auVar184._8_4_ = fVar156 * auVar241._8_4_ * fVar217;
              auVar184._12_4_ = fVar216 * auVar241._12_4_ * fVar217;
              auVar84 = vdpps_avx(auVar86,local_860,0x7f);
              auVar241 = vfmadd213ss_fma(auVar83,ZEXT416((uint)fVar191),auVar233);
              auVar83 = vdpps_avx(local_880._0_16_,auVar184,0x7f);
              auVar241 = vfmadd213ss_fma(ZEXT416((uint)(fVar209 + 1.0)),
                                         ZEXT416((uint)(fVar191 / fVar208)),auVar241);
              fVar139 = auVar84._0_4_ + auVar83._0_4_;
              auVar83 = vdpps_avx(local_4e0._0_16_,local_860,0x7f);
              auVar84 = vdpps_avx(local_880._0_16_,auVar86,0x7f);
              fVar208 = auVar82._0_4_;
              fVar207 = auVar85._0_4_ * 1.5 + fVar208 * fVar207 * -0.5 * fVar208 * fVar208;
              auVar82 = vdpps_avx(local_880._0_16_,local_4e0._0_16_,0x7f);
              auVar86 = vfnmadd231ss_fma(auVar84,auVar87,ZEXT416((uint)fVar139));
              auVar82 = vfnmadd231ss_fma(auVar82,auVar87,auVar83);
              auVar84 = vpermilps_avx(local_400._0_16_,0xff);
              fVar210 = fVar210 - auVar84._0_4_;
              auVar85 = vshufps_avx(auVar81,auVar81,0xff);
              auVar84 = vfmsub213ss_fma(auVar86,ZEXT416((uint)fVar207),auVar85);
              auVar243 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
              auVar235._0_8_ = auVar84._0_8_ ^ 0x8000000080000000;
              auVar235._8_4_ = auVar84._8_4_ ^ 0x80000000;
              auVar235._12_4_ = auVar84._12_4_ ^ 0x80000000;
              auVar82 = ZEXT416((uint)(auVar82._0_4_ * fVar207));
              auVar86 = vfmsub231ss_fma(ZEXT416((uint)(auVar83._0_4_ * auVar84._0_4_)),
                                        ZEXT416((uint)fVar139),auVar82);
              auVar84 = vinsertps_avx(auVar235,auVar82,0x1c);
              auVar225._0_8_ = auVar83._0_8_ ^ 0x8000000080000000;
              auVar225._8_4_ = auVar83._8_4_ ^ 0x80000000;
              auVar225._12_4_ = auVar83._12_4_ ^ 0x80000000;
              auVar82 = vinsertps_avx(ZEXT416((uint)fVar139),auVar225,0x10);
              auVar203._0_4_ = auVar86._0_4_;
              auVar203._4_4_ = auVar203._0_4_;
              auVar203._8_4_ = auVar203._0_4_;
              auVar203._12_4_ = auVar203._0_4_;
              auVar83 = vdivps_avx(auVar84,auVar203);
              auVar84 = vdivps_avx(auVar82,auVar203);
              fVar139 = auVar87._0_4_;
              auVar204._0_4_ = fVar139 * auVar83._0_4_ + fVar210 * auVar84._0_4_;
              auVar204._4_4_ = fVar139 * auVar83._4_4_ + fVar210 * auVar84._4_4_;
              auVar204._8_4_ = fVar139 * auVar83._8_4_ + fVar210 * auVar84._8_4_;
              auVar204._12_4_ = fVar139 * auVar83._12_4_ + fVar210 * auVar84._12_4_;
              auVar83 = vsubps_avx(local_500._0_16_,auVar204);
              auVar25._8_4_ = 0x7fffffff;
              auVar25._0_8_ = 0x7fffffff7fffffff;
              auVar25._12_4_ = 0x7fffffff;
              auVar84 = vandps_avx512vl(auVar87,auVar25);
              if (auVar84._0_4_ < auVar241._0_4_) {
                auVar84 = vfmadd231ss_fma(ZEXT416((uint)(auVar241._0_4_ + auVar233._0_4_)),local_4b0
                                          ,ZEXT416(0x36000000));
                auVar26._8_4_ = 0x7fffffff;
                auVar26._0_8_ = 0x7fffffff7fffffff;
                auVar26._12_4_ = 0x7fffffff;
                auVar87 = vandps_avx512vl(ZEXT416((uint)fVar210),auVar26);
                if (auVar87._0_4_ < auVar84._0_4_) {
                  fVar216 = auVar83._0_4_ + (float)local_4c0._0_4_;
                  bVar70 = 0;
                  bVar71 = 0;
                  if (fVar216 < (ray->org).field_0.m128[3]) goto LAB_01d0de87;
                  fVar217 = ray->tfar;
                  auVar243 = ZEXT464((uint)fVar217);
                  auVar238 = ZEXT3264(_local_5a0);
                  fVar192 = (float)local_8c0._0_4_;
                  fVar139 = (float)local_8c0._4_4_;
                  fVar207 = fStack_8b8;
                  fVar208 = fStack_8b4;
                  fVar209 = fStack_8b0;
                  fVar210 = fStack_8ac;
                  fVar211 = fStack_8a8;
                  fVar156 = fStack_8a4;
                  if (fVar217 < fVar216) goto LAB_01d0de90;
                  auVar83 = vmovshdup_avx(auVar83);
                  bVar70 = 0;
                  fVar218 = auVar83._0_4_;
                  if ((fVar218 < 0.0) || (1.0 < fVar218)) goto LAB_01d0de90;
                  auVar66._12_4_ = 0;
                  auVar66._0_12_ = ZEXT412(0);
                  auVar131._4_12_ = ZEXT412(0);
                  auVar131._0_4_ = local_8a0._0_4_;
                  auVar83 = vrsqrt14ss_avx512f(auVar66 << 0x20,auVar131._0_16_);
                  fVar219 = auVar83._0_4_;
                  auVar83 = vmulss_avx512f(_local_8a0,ZEXT416(0xbf000000));
                  pGVar4 = (context->scene->geometries).items[local_8e8].ptr;
                  if ((pGVar4->mask & ray->mask) == 0) {
                    bVar70 = 0;
                    goto LAB_01d0de90;
                  }
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (bVar70 = 1, pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0))
                  goto LAB_01d0de90;
                  local_8e0._0_4_ = fVar217;
                  fVar192 = fVar219 * 1.5 + auVar83._0_4_ * fVar219 * fVar219 * fVar219;
                  auVar205._0_4_ = local_880._0_4_ * fVar192;
                  auVar205._4_4_ = local_880._4_4_ * fVar192;
                  auVar205._8_4_ = local_880._8_4_ * fVar192;
                  auVar205._12_4_ = local_880._12_4_ * fVar192;
                  auVar87 = vfmadd213ps_fma(auVar85,auVar205,auVar81);
                  auVar83 = vshufps_avx(auVar205,auVar205,0xc9);
                  auVar84 = vshufps_avx(auVar81,auVar81,0xc9);
                  auVar206._0_4_ = auVar205._0_4_ * auVar84._0_4_;
                  auVar206._4_4_ = auVar205._4_4_ * auVar84._4_4_;
                  auVar206._8_4_ = auVar205._8_4_ * auVar84._8_4_;
                  auVar206._12_4_ = auVar205._12_4_ * auVar84._12_4_;
                  auVar81 = vfmsub231ps_fma(auVar206,auVar81,auVar83);
                  auVar83 = vshufps_avx(auVar81,auVar81,0xc9);
                  auVar84 = vshufps_avx(auVar87,auVar87,0xc9);
                  auVar81 = vshufps_avx(auVar81,auVar81,0xd2);
                  auVar148._0_4_ = auVar87._0_4_ * auVar81._0_4_;
                  auVar148._4_4_ = auVar87._4_4_ * auVar81._4_4_;
                  auVar148._8_4_ = auVar87._8_4_ * auVar81._8_4_;
                  auVar148._12_4_ = auVar87._12_4_ * auVar81._12_4_;
                  auVar84 = vfmsub231ps_fma(auVar148,auVar83,auVar84);
                  auVar83 = vshufps_avx(auVar84,auVar84,0xe9);
                  local_600 = vmovlps_avx(auVar83);
                  local_5f8 = auVar84._0_4_;
                  local_5f4 = fVar218;
                  local_5f0 = 0;
                  local_5ec = (int)local_5c8;
                  local_5e8 = (int)local_8e8;
                  local_5e4 = context->user->instID[0];
                  local_5e0 = context->user->instPrimID[0];
                  ray->tfar = fVar216;
                  local_8f0 = -1;
                  local_750.valid = &local_8f0;
                  local_750.geometryUserPtr = pGVar4->userPtr;
                  local_750.context = context->user;
                  local_750.ray = (RTCRayN *)ray;
                  local_750.hit = (RTCHitN *)&local_600;
                  local_750.N = 1;
                  if (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01d0e0a7:
                    p_Var5 = context->args->filter;
                    if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar243 = ZEXT1664(auVar243._0_16_);
                      auVar251 = ZEXT1664(auVar251._0_16_);
                      (*p_Var5)(&local_750);
                      if (*local_750.valid == 0) goto LAB_01d0e0fd;
                    }
                    bVar71 = 1;
                  }
                  else {
                    auVar243 = ZEXT464((uint)fVar217);
                    auVar251 = ZEXT1664(local_880._0_16_);
                    (*pGVar4->occlusionFilterN)(&local_750);
                    if (*local_750.valid != 0) goto LAB_01d0e0a7;
LAB_01d0e0fd:
                    ray->tfar = (float)local_8e0._0_4_;
                    bVar71 = 0;
                  }
                  auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar268 = ZEXT3264(auVar94);
                  auVar260 = ZEXT3264(local_620);
                  auVar263 = ZEXT3264(local_5c0);
                  auVar262 = ZEXT3264(local_7c0);
                  auVar255 = ZEXT3264(local_680);
                  auVar256 = ZEXT3264(local_6a0);
                  auVar257 = ZEXT3264(local_7e0);
                  auVar258 = ZEXT3264(local_6c0);
                  auVar259 = ZEXT3264(local_800);
                  auVar261 = ZEXT3264(local_6e0);
                  auVar264 = ZEXT3264(local_780);
                  auVar265 = ZEXT3264(local_7a0);
                  auVar266 = ZEXT3264(local_700);
                  auVar267 = ZEXT3264(local_720);
                  auVar269 = ZEXT3264(local_820);
                  goto LAB_01d0de87;
                }
              }
              bVar79 = uVar80 < 4;
              uVar80 = uVar80 + 1;
            } while (uVar80 != 5);
            bVar79 = false;
            bVar71 = 5;
LAB_01d0de87:
            bVar70 = bVar71;
            auVar238 = ZEXT3264(_local_5a0);
            fVar192 = (float)local_8c0._0_4_;
            fVar139 = (float)local_8c0._4_4_;
            fVar207 = fStack_8b8;
            fVar208 = fStack_8b4;
            fVar209 = fStack_8b0;
            fVar210 = fStack_8ac;
            fVar211 = fStack_8a8;
            fVar156 = fStack_8a4;
LAB_01d0de90:
            bVar78 = (bool)(bVar78 | bVar79 & bVar70);
            fVar216 = ray->tfar;
            auVar154._4_4_ = fVar216;
            auVar154._0_4_ = fVar216;
            auVar154._8_4_ = fVar216;
            auVar154._12_4_ = fVar216;
            auVar154._16_4_ = fVar216;
            auVar154._20_4_ = fVar216;
            auVar154._24_4_ = fVar216;
            auVar154._28_4_ = fVar216;
            auVar68._4_4_ = fStack_3bc;
            auVar68._0_4_ = local_3c0;
            auVar68._8_4_ = fStack_3b8;
            auVar68._12_4_ = fStack_3b4;
            auVar68._16_4_ = fStack_3b0;
            auVar68._20_4_ = fStack_3ac;
            auVar68._24_4_ = fStack_3a8;
            auVar68._28_4_ = fStack_3a4;
            uVar14 = vcmpps_avx512vl(auVar154,auVar68,0xd);
            bVar73 = ~('\x01' << ((byte)iVar18 & 0x1f)) & bVar73 & (byte)uVar14;
          } while (bVar73 != 0);
          auVar238 = ZEXT3264(local_300);
        }
        uVar16 = vpcmpgtd_avx512vl(local_3e0,local_380);
        uVar17 = vpcmpd_avx512vl(local_380,local_280,1);
        auVar189._0_4_ = fVar192 + (float)local_2c0._0_4_;
        auVar189._4_4_ = fVar139 + (float)local_2c0._4_4_;
        auVar189._8_4_ = fVar207 + fStack_2b8;
        auVar189._12_4_ = fVar208 + fStack_2b4;
        auVar189._16_4_ = fVar209 + fStack_2b0;
        auVar189._20_4_ = fVar210 + fStack_2ac;
        auVar189._24_4_ = fVar211 + fStack_2a8;
        auVar189._28_4_ = fVar156 + fStack_2a4;
        uVar14 = vcmpps_avx512vl(auVar189,auVar154,2);
        bVar73 = (byte)local_824 & (byte)uVar17 & (byte)uVar14;
        auVar190._0_4_ = fVar192 + auVar238._0_4_;
        auVar190._4_4_ = fVar139 + auVar238._4_4_;
        auVar190._8_4_ = fVar207 + auVar238._8_4_;
        auVar190._12_4_ = fVar208 + auVar238._12_4_;
        auVar190._16_4_ = fVar209 + auVar238._16_4_;
        auVar190._20_4_ = fVar210 + auVar238._20_4_;
        auVar190._24_4_ = fVar211 + auVar238._24_4_;
        auVar190._28_4_ = fVar156 + auVar238._28_4_;
        uVar14 = vcmpps_avx512vl(auVar190,auVar154,2);
        bVar69 = bVar69 & (byte)uVar16 & (byte)uVar14 | bVar73;
        prim = local_470;
        if (bVar69 != 0) {
          abStack_180[uVar76 * 0x60] = bVar69;
          auVar132._0_4_ =
               (uint)(bVar73 & 1) * local_2c0._0_4_ |
               (uint)!(bool)(bVar73 & 1) * (int)auVar238._0_4_;
          bVar79 = (bool)(bVar73 >> 1 & 1);
          auVar132._4_4_ = (uint)bVar79 * local_2c0._4_4_ | (uint)!bVar79 * (int)auVar238._4_4_;
          bVar79 = (bool)(bVar73 >> 2 & 1);
          auVar132._8_4_ = (uint)bVar79 * (int)fStack_2b8 | (uint)!bVar79 * (int)auVar238._8_4_;
          bVar79 = (bool)(bVar73 >> 3 & 1);
          auVar132._12_4_ = (uint)bVar79 * (int)fStack_2b4 | (uint)!bVar79 * (int)auVar238._12_4_;
          bVar79 = (bool)(bVar73 >> 4 & 1);
          auVar132._16_4_ = (uint)bVar79 * (int)fStack_2b0 | (uint)!bVar79 * (int)auVar238._16_4_;
          bVar79 = (bool)(bVar73 >> 5 & 1);
          auVar132._20_4_ = (uint)bVar79 * (int)fStack_2ac | (uint)!bVar79 * (int)auVar238._20_4_;
          bVar79 = (bool)(bVar73 >> 6 & 1);
          auVar132._24_4_ = (uint)bVar79 * (int)fStack_2a8 | (uint)!bVar79 * (int)auVar238._24_4_;
          auVar132._28_4_ =
               (uint)(bVar73 >> 7) * (int)fStack_2a4 |
               (uint)!(bool)(bVar73 >> 7) * (int)auVar238._28_4_;
          auVar238 = ZEXT3264(auVar132);
          *(undefined1 (*) [32])(auStack_160 + uVar76 * 0x60) = auVar132;
          uVar80 = vmovlps_avx(local_390);
          (&uStack_140)[uVar76 * 0xc] = uVar80;
          aiStack_138[uVar76 * 0x18] = local_908 + 1;
          uVar76 = (ulong)((int)uVar76 + 1);
        }
      }
    }
    fVar191 = ray->tfar;
    auVar150._4_4_ = fVar191;
    auVar150._0_4_ = fVar191;
    auVar150._8_4_ = fVar191;
    auVar150._12_4_ = fVar191;
    auVar150._16_4_ = fVar191;
    auVar150._20_4_ = fVar191;
    auVar150._24_4_ = fVar191;
    auVar150._28_4_ = fVar191;
    do {
      uVar75 = (uint)uVar76;
      uVar76 = (ulong)(uVar75 - 1);
      if (uVar75 == 0) {
        if (bVar78 != false) {
          return bVar78;
        }
        uVar14 = vcmpps_avx512vl(auVar150,local_260,0xd);
        uVar75 = (uint)local_468 & (uint)uVar14;
        local_468 = (ulong)uVar75;
        if (uVar75 == 0) {
          return false;
        }
        goto LAB_01d0bafd;
      }
      lVar74 = uVar76 * 0x60;
      auVar94 = *(undefined1 (*) [32])(auStack_160 + lVar74);
      auVar187._0_4_ = fVar192 + auVar94._0_4_;
      auVar187._4_4_ = fVar139 + auVar94._4_4_;
      auVar187._8_4_ = fVar207 + auVar94._8_4_;
      auVar187._12_4_ = fVar208 + auVar94._12_4_;
      auVar187._16_4_ = fVar209 + auVar94._16_4_;
      auVar187._20_4_ = fVar210 + auVar94._20_4_;
      auVar187._24_4_ = fVar211 + auVar94._24_4_;
      auVar187._28_4_ = fVar156 + auVar94._28_4_;
      uVar14 = vcmpps_avx512vl(auVar187,auVar150,2);
      uVar72 = (uint)uVar14 & (uint)abStack_180[lVar74];
    } while (uVar72 == 0);
    uVar80 = (&uStack_140)[uVar76 * 0xc];
    auVar142._8_8_ = 0;
    auVar142._0_8_ = uVar80;
    auVar188._8_4_ = 0x7f800000;
    auVar188._0_8_ = 0x7f8000007f800000;
    auVar188._12_4_ = 0x7f800000;
    auVar188._16_4_ = 0x7f800000;
    auVar188._20_4_ = 0x7f800000;
    auVar188._24_4_ = 0x7f800000;
    auVar188._28_4_ = 0x7f800000;
    auVar91 = vblendmps_avx512vl(auVar188,auVar94);
    bVar69 = (byte)uVar72;
    auVar127._0_4_ =
         (uint)(bVar69 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar69 & 1) * (int)auVar94._0_4_;
    bVar79 = (bool)((byte)(uVar72 >> 1) & 1);
    auVar127._4_4_ = (uint)bVar79 * auVar91._4_4_ | (uint)!bVar79 * (int)auVar94._4_4_;
    bVar79 = (bool)((byte)(uVar72 >> 2) & 1);
    auVar127._8_4_ = (uint)bVar79 * auVar91._8_4_ | (uint)!bVar79 * (int)auVar94._8_4_;
    bVar79 = (bool)((byte)(uVar72 >> 3) & 1);
    auVar127._12_4_ = (uint)bVar79 * auVar91._12_4_ | (uint)!bVar79 * (int)auVar94._12_4_;
    bVar79 = (bool)((byte)(uVar72 >> 4) & 1);
    auVar127._16_4_ = (uint)bVar79 * auVar91._16_4_ | (uint)!bVar79 * (int)auVar94._16_4_;
    bVar79 = (bool)((byte)(uVar72 >> 5) & 1);
    auVar127._20_4_ = (uint)bVar79 * auVar91._20_4_ | (uint)!bVar79 * (int)auVar94._20_4_;
    bVar79 = (bool)((byte)(uVar72 >> 6) & 1);
    auVar127._24_4_ = (uint)bVar79 * auVar91._24_4_ | (uint)!bVar79 * (int)auVar94._24_4_;
    auVar127._28_4_ =
         (uVar72 >> 7) * auVar91._28_4_ | (uint)!SUB41(uVar72 >> 7,0) * (int)auVar94._28_4_;
    auVar94 = vshufps_avx(auVar127,auVar127,0xb1);
    auVar94 = vminps_avx(auVar127,auVar94);
    auVar91 = vshufpd_avx(auVar94,auVar94,5);
    auVar94 = vminps_avx(auVar94,auVar91);
    auVar91 = vpermpd_avx2(auVar94,0x4e);
    auVar94 = vminps_avx(auVar94,auVar91);
    uVar14 = vcmpps_avx512vl(auVar127,auVar94,0);
    bVar73 = (byte)uVar14 & bVar69;
    if (bVar73 != 0) {
      uVar72 = (uint)bVar73;
    }
    uVar133 = 0;
    for (; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x80000000) {
      uVar133 = uVar133 + 1;
    }
    local_908 = aiStack_138[uVar76 * 0x18];
    bVar69 = ~('\x01' << ((byte)uVar133 & 0x1f)) & bVar69;
    abStack_180[lVar74] = bVar69;
    if (bVar69 == 0) {
      uVar75 = uVar75 - 1;
    }
    uVar140 = (undefined4)uVar80;
    auVar168._4_4_ = uVar140;
    auVar168._0_4_ = uVar140;
    auVar168._8_4_ = uVar140;
    auVar168._12_4_ = uVar140;
    auVar168._16_4_ = uVar140;
    auVar168._20_4_ = uVar140;
    auVar168._24_4_ = uVar140;
    auVar168._28_4_ = uVar140;
    auVar83 = vmovshdup_avx(auVar142);
    auVar83 = vsubps_avx(auVar83,auVar142);
    auVar151._0_4_ = auVar83._0_4_;
    auVar151._4_4_ = auVar151._0_4_;
    auVar151._8_4_ = auVar151._0_4_;
    auVar151._12_4_ = auVar151._0_4_;
    auVar151._16_4_ = auVar151._0_4_;
    auVar151._20_4_ = auVar151._0_4_;
    auVar151._24_4_ = auVar151._0_4_;
    auVar151._28_4_ = auVar151._0_4_;
    auVar83 = vfmadd132ps_fma(auVar151,auVar168,_DAT_01faff20);
    _local_2c0 = ZEXT1632(auVar83);
    local_390._8_8_ = 0;
    local_390._0_8_ = *(ulong *)(local_2c0 + (ulong)uVar133 * 4);
    uVar76 = (ulong)uVar75;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }